

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void mbedtls_strerror(int ret,char *buf,size_t buflen)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  char *__format;
  uint uVar5;
  char *__format_00;
  char *__format_01;
  char *__format_02;
  char *__format_03;
  size_t local_68;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  
  if (buflen == 0) {
    return;
  }
  memset(buf,0,buflen);
  uVar1 = -ret;
  if (0 < ret) {
    uVar1 = ret;
  }
  uVar5 = uVar1 & 0xff80;
  __format = "PEM - Private key password can\'t be empty";
  pcVar4 = "PEM - RSA IV is not in hex-format";
  __format_02 = "PEM - PEM string is not as expected";
  __format_03 = "ECP - Invalid private or public key";
  __format_01 = "ECP - Generation of random value, such as (ephemeral) key, failed";
  __format_00 = "ECP - Memory allocation failed";
  if (uVar5 < 0x3b80) {
    if (0x2eff < uVar5) {
      if (uVar5 < 0x3380) {
        if (0x317f < uVar5) {
          if (uVar5 < 0x3280) {
            if (uVar5 == 0x3180) {
              pcVar4 = "DHM - Making of the DHM parameters failed";
            }
            else {
              if (uVar5 != 0x3200) goto LAB_001364e8;
              pcVar4 = "DHM - Reading of the public values failed";
            }
          }
          else {
            if (uVar5 != 0x3280) {
              if (uVar5 == 0x3300) {
                pcVar4 = "DHM - Calculation of the DHM secret failed";
                goto LAB_00138fa8;
              }
              goto LAB_001364e8;
            }
            pcVar4 = "DHM - Making of the public value failed";
          }
LAB_00136836:
          snprintf(buf,buflen,pcVar4);
LAB_0013684c:
          switch(uVar5 - 0x6780 >> 7) {
          case 0:
            goto switchD_0013862d_caseD_0;
          case 1:
            goto switchD_0013862d_caseD_1;
          case 2:
            goto switchD_0013862d_caseD_2;
          case 3:
            goto switchD_0013862d_caseD_3;
          case 4:
            goto switchD_00138515_caseD_1;
          case 5:
            goto switchD_00138515_caseD_2;
          case 6:
            goto switchD_00138515_caseD_3;
          case 7:
            goto switchD_001368ad_caseD_8;
          case 8:
            goto switchD_001380bf_caseD_0;
          case 9:
            goto switchD_0013807c_caseD_0;
          case 10:
            goto switchD_0013807c_caseD_1;
          case 0xb:
            goto switchD_0013807c_caseD_2;
          case 0xc:
            goto switchD_0013807c_caseD_3;
          case 0xd:
            goto switchD_001368ad_caseD_e;
          case 0xe:
            goto switchD_001368ad_caseD_f;
          case 0xf:
            goto switchD_001368ad_caseD_10;
          case 0x10:
            goto switchD_001368ad_caseD_11;
          case 0x18:
            goto switchD_001367ad_caseD_3;
          case 0x19:
            goto switchD_001367ad_caseD_4;
          case 0x1a:
            goto switchD_001367ad_caseD_5;
          case 0x1b:
            goto switchD_001367ad_caseD_6;
          case 0x1c:
            goto switchD_001367ad_caseD_7;
          case 0x1d:
            goto switchD_001367ad_caseD_8;
          case 0x1e:
            goto switchD_001367ad_caseD_9;
          case 0x1f:
            goto switchD_001367ad_caseD_a;
          case 0x20:
            goto switchD_001367ad_caseD_b;
          case 0x21:
            goto switchD_001367ad_caseD_c;
          case 0x22:
            goto switchD_001367ad_caseD_d;
          case 0x23:
            goto switchD_001367ad_caseD_e;
          case 0x24:
            goto switchD_001367ad_caseD_f;
          case 0x25:
            goto switchD_001367ad_caseD_10;
          case 0x26:
            goto switchD_001367ad_caseD_11;
          case 0x27:
            goto switchD_001367ad_caseD_12;
          case 0x28:
            goto switchD_001367ad_caseD_13;
          case 0x29:
            goto switchD_001367ad_caseD_14;
          case 0x2a:
            goto switchD_001367ad_caseD_15;
          case 0x2b:
            goto switchD_001367ad_caseD_16;
          case 0x2c:
            goto switchD_001367ad_caseD_17;
          case 0x2d:
            goto switchD_001367ad_caseD_18;
          case 0x2e:
            goto switchD_001368ad_caseD_2f;
          case 0x2f:
            goto switchD_001368ad_caseD_30;
          case 0x30:
            goto switchD_001368ad_caseD_31;
          }
          goto switchD_0013862d_default;
        }
        if (uVar5 < 0x3080) {
          if (uVar5 != 0x2f00) {
            if (uVar5 == 0x2f80) {
switchD_001359c0_caseD_23:
              pcVar4 = "PKCS5 - Bad input parameters to function";
              goto LAB_0013914c;
            }
            goto LAB_001364e8;
          }
switchD_001359c0_caseD_22:
          pcVar4 = "PKCS5 - Unexpected ASN.1 data";
        }
        else {
          if (uVar5 != 0x3080) {
            if (uVar5 == 0x3100) {
              pcVar4 = "DHM - Reading of the DHM parameters failed";
              goto LAB_00136836;
            }
            goto LAB_001364e8;
          }
          pcVar4 = "DHM - Bad input parameters to function";
        }
        goto LAB_00138fa8;
      }
      if (0x397f < uVar5) {
        local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
        if (0x3a7f < uVar5) {
          if (uVar5 != 0x3a80) {
            if (uVar5 != 0x3b00) goto LAB_001364e8;
            goto switchD_001359c0_caseD_3a;
          }
          goto switchD_001359c0_caseD_39;
        }
        if (uVar5 != 0x3980) {
          if (uVar5 != 0x3a00) goto LAB_001364e8;
          goto switchD_001359c0_caseD_38;
        }
        goto switchD_001359c0_caseD_37;
      }
      if (0x347f < uVar5) {
        if (uVar5 != 0x3480) {
          if (uVar5 != 0x3900) goto LAB_001364e8;
switchD_001359c0_caseD_36:
          pcVar4 = "PK - The signature is valid but its length is less than expected";
          goto LAB_00138fa8;
        }
        snprintf(buf,buflen,"DHM - Read/write of file failed");
        goto LAB_00138fff;
      }
      if (uVar5 == 0x3380) {
        pcVar4 = "DHM - The ASN.1 data is not formatted correctly";
        goto LAB_00138fa8;
      }
      if (uVar5 != 0x3400) goto LAB_001364e8;
      pcVar4 = "DHM - Allocation of memory failed";
      goto LAB_00138feb;
    }
    if (0x13ff < uVar5) {
      if (uVar5 < 0x1f00) {
        local_58 = "PKCS12 - PBE ASN.1 data not as expected";
        if (uVar5 < 0x1e00) {
          if (uVar5 != 0x1400) {
            if (uVar5 != 0x1480) goto LAB_001364e8;
            pcVar4 = "PEM - Bad input parameters to function";
LAB_00136633:
            snprintf(buf,buflen,pcVar4);
            goto LAB_00136649;
          }
          __format_00 = "PEM - Unavailable feature, e.g. hashing/encryption combination";
LAB_00135fad:
          local_58 = "PKCS12 - PBE ASN.1 data not as expected";
          local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
          local_50 = "RSA - Bad input parameters to function";
          snprintf(buf,buflen,__format_00);
          if (uVar5 < 0x3b80) {
            if (uVar5 < 0x2f00) {
              if (uVar5 < 0x1f80) {
                if (uVar5 == 0x1e00) goto switchD_001359c0_caseD_0;
                if (uVar5 == 0x1e80) goto switchD_001359c0_caseD_1;
                if (uVar5 == 0x1f00) goto switchD_001359c0_caseD_2;
              }
              else {
                if (uVar5 == 0x1f80) goto switchD_001359c0_caseD_3;
                if (uVar5 == 0x2e00) goto switchD_001359c0_caseD_20;
                if (uVar5 == 0x2e80) goto switchD_001359c0_caseD_21;
              }
            }
            else if (uVar5 < 0x3980) {
              if (uVar5 == 0x2f00) goto switchD_001359c0_caseD_22;
              if (uVar5 == 0x2f80) goto switchD_001359c0_caseD_23;
              if (uVar5 == 0x3900) goto switchD_001359c0_caseD_36;
            }
            else if (uVar5 < 0x3a80) {
              if (uVar5 == 0x3980) goto switchD_001359c0_caseD_37;
              if (uVar5 == 0x3a00) goto switchD_001359c0_caseD_38;
            }
            else {
              if (uVar5 == 0x3a80) goto switchD_001359c0_caseD_39;
              if (uVar5 == 0x3b00) goto switchD_001359c0_caseD_3a;
            }
          }
          else if (uVar5 < 0x4180) {
            if (uVar5 < 0x3d00) {
              if (uVar5 == 0x3b80) goto switchD_001359c0_caseD_3b;
              if (uVar5 == 0x3c00) goto switchD_001359c0_caseD_3c;
              if (uVar5 == 0x3c80) goto switchD_001359c0_caseD_3d;
            }
            else {
              if (uVar5 == 0x3d00) goto switchD_001359c0_caseD_3e;
              if (uVar5 == 0x4080) goto switchD_001359c0_caseD_45;
              local_40 = "RSA - Input data contains invalid padding and is rejected";
              if (uVar5 == 0x4100) goto switchD_001359c0_caseD_46;
            }
          }
          else if (uVar5 < 0x4300) {
            if (uVar5 == 0x4180) goto switchD_001359c0_caseD_47;
            if (uVar5 == 0x4200) goto switchD_001359c0_caseD_48;
            if (uVar5 == 0x4280) goto switchD_001359c0_caseD_49;
          }
          else if (uVar5 < 0x4400) {
            if (uVar5 == 0x4300) goto LAB_001362c7;
            if (uVar5 == 0x4380) goto switchD_001359c0_caseD_4b;
          }
          else {
            if (uVar5 == 0x4400) goto switchD_001359c0_caseD_4c;
            if (uVar5 == 0x4480) goto switchD_001359c0_caseD_4d;
          }
          goto LAB_0013684c;
        }
        if (uVar5 == 0x1e00) goto switchD_001359c0_caseD_0;
        if (uVar5 != 0x1e80) goto LAB_001364e8;
        goto switchD_001359c0_caseD_1;
      }
      if (uVar5 < 0x2e00) {
        if (uVar5 == 0x1f00) {
switchD_001359c0_caseD_2:
          pcVar4 = "PKCS12 - Feature not available, e.g. unsupported encryption scheme";
        }
        else {
          if (uVar5 != 0x1f80) goto LAB_001364e8;
switchD_001359c0_caseD_3:
          pcVar4 = "PKCS12 - Bad input parameters to function";
        }
        goto LAB_0013914c;
      }
      if (uVar5 != 0x2e00) {
        if (uVar5 != 0x2e80) goto LAB_001364e8;
switchD_001359c0_caseD_21:
        pcVar4 = "PKCS5 - Requested encryption or digest alg not available";
        goto LAB_0013914c;
      }
switchD_001359c0_caseD_20:
      snprintf(buf,buflen,"PKCS5 - Given private key password does not allow for correct decryption"
              );
      uVar2 = uVar5 - 0x4080 >> 7;
      if (uVar2 < 5) {
        (*(code *)(&DAT_0015a4ec + *(int *)(&DAT_0015a4ec + (ulong)uVar2 * 4)))();
        return;
      }
      goto switchD_001390aa_default;
    }
    if (0x11ff < uVar5) {
      if (uVar5 < 0x1300) {
        if (uVar5 != 0x1200) {
          if (uVar5 != 0x1280) goto LAB_001364e8;
          pcVar4 = "PEM - Unsupported key encryption algorithm";
        }
LAB_00135f0b:
        local_58 = "PKCS12 - PBE ASN.1 data not as expected";
        local_40 = "RSA - Input data contains invalid padding and is rejected";
        local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
        local_50 = "RSA - Bad input parameters to function";
        snprintf(buf,buflen,pcVar4);
        if (uVar5 < 0x3c00) {
          if (uVar5 < 0x2f80) {
            if (uVar5 < 0x1f80) {
              if (uVar5 == 0x1e00) goto switchD_001359c0_caseD_0;
              if (uVar5 == 0x1e80) goto switchD_001359c0_caseD_1;
              if (uVar5 == 0x1f00) goto switchD_001359c0_caseD_2;
            }
            else if (uVar5 < 0x2e80) {
              if (uVar5 == 0x1f80) goto switchD_001359c0_caseD_3;
              if (uVar5 == 0x2e00) goto switchD_001359c0_caseD_20;
            }
            else {
              if (uVar5 == 0x2e80) goto switchD_001359c0_caseD_21;
              if (uVar5 == 0x2f00) goto switchD_001359c0_caseD_22;
            }
          }
          else if (uVar5 < 0x3a00) {
            if (uVar5 == 0x2f80) goto switchD_001359c0_caseD_23;
            if (uVar5 == 0x3900) goto switchD_001359c0_caseD_36;
            if (uVar5 == 0x3980) goto switchD_001359c0_caseD_37;
          }
          else if (uVar5 < 0x3b00) {
            if (uVar5 == 0x3a00) goto switchD_001359c0_caseD_38;
            if (uVar5 == 0x3a80) goto switchD_001359c0_caseD_39;
          }
          else {
            if (uVar5 == 0x3b00) goto switchD_001359c0_caseD_3a;
            if (uVar5 == 0x3b80) goto switchD_001359c0_caseD_3b;
          }
        }
        else if (uVar5 < 0x4180) {
          if (uVar5 < 0x3d80) {
            if (uVar5 == 0x3c00) goto switchD_001359c0_caseD_3c;
            if (uVar5 == 0x3c80) goto switchD_001359c0_caseD_3d;
            if (uVar5 == 0x3d00) goto switchD_001359c0_caseD_3e;
          }
          else if (uVar5 < 0x4080) {
            if (uVar5 == 0x3d80) goto switchD_001359c0_caseD_3f;
            if (uVar5 == 0x3e00) goto switchD_00135f02_caseD_3;
          }
          else {
            if (uVar5 == 0x4080) goto switchD_001359c0_caseD_45;
            if (uVar5 == 0x4100) goto switchD_001359c0_caseD_46;
          }
        }
        else if (uVar5 < 0x4300) {
          if (uVar5 == 0x4180) goto switchD_001359c0_caseD_47;
          if (uVar5 == 0x4200) goto switchD_001359c0_caseD_48;
          if (uVar5 == 0x4280) goto switchD_001359c0_caseD_49;
        }
        else if (uVar5 < 0x4400) {
          if (uVar5 == 0x4300) goto LAB_001362c7;
          if (uVar5 == 0x4380) goto switchD_001359c0_caseD_4b;
        }
        else {
          if (uVar5 == 0x4400) goto switchD_001359c0_caseD_4c;
          if (uVar5 == 0x4480) goto switchD_001359c0_caseD_4d;
        }
        goto LAB_001367cc;
      }
      if (uVar5 != 0x1300) {
        if (uVar5 != 0x1380) goto LAB_001364e8;
        pcVar4 = "PEM - Given private key password does not allow for correct decryption";
        goto LAB_001368c7;
      }
LAB_00135982:
      local_58 = "PKCS12 - PBE ASN.1 data not as expected";
      local_40 = "RSA - Input data contains invalid padding and is rejected";
      local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
      local_50 = "RSA - Bad input parameters to function";
      snprintf(buf,buflen,__format);
      switch((uVar5 - 0x1e00 & 0xffff) >> 7) {
      case 0:
switchD_001359c0_caseD_0:
        pcVar4 = "PKCS12 - Given private key password does not allow for correct decryption";
        goto LAB_0013914c;
      case 1:
        goto switchD_001359c0_caseD_1;
      case 2:
        goto switchD_001359c0_caseD_2;
      case 3:
        goto switchD_001359c0_caseD_3;
      case 5:
        goto switchD_00138b4e_caseD_0;
      case 6:
        goto switchD_00138b8e_caseD_0;
      case 7:
        goto switchD_00138bce_caseD_0;
      case 8:
        goto switchD_00138c0e_caseD_0;
      case 9:
        goto switchD_00138c51_caseD_0;
      case 10:
        goto switchD_00138c51_caseD_1;
      case 0x20:
        goto switchD_001359c0_caseD_20;
      case 0x21:
        goto switchD_001359c0_caseD_21;
      case 0x22:
        goto switchD_001359c0_caseD_22;
      case 0x23:
        goto switchD_001359c0_caseD_23;
      case 0x36:
        goto switchD_001359c0_caseD_36;
      case 0x37:
        goto switchD_001359c0_caseD_37;
      case 0x38:
switchD_001359c0_caseD_38:
        snprintf(buf,buflen,"PK - Elliptic curve is unsupported (only NIST curves are supported)");
        goto switchD_001354af_default;
      case 0x39:
switchD_001359c0_caseD_39:
        __format_03 = "PK - The algorithm tag or value is invalid";
        goto LAB_0013639c;
      case 0x3a:
switchD_001359c0_caseD_3a:
        __format_01 = "PK - The pubkey tag or value is invalid (only RSA and EC are supported)";
        goto LAB_00135844;
      case 0x3b:
        goto switchD_001359c0_caseD_3b;
      case 0x3c:
switchD_001359c0_caseD_3c:
        pcVar4 = "PK - Private key password can\'t be empty";
        goto LAB_0013914c;
      case 0x3d:
        goto switchD_001359c0_caseD_3d;
      case 0x3e:
switchD_001359c0_caseD_3e:
        local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
        snprintf(buf,buflen,"PK - Invalid key tag or value");
        switch(uVar5 - 0x3980 >> 7) {
        case 0:
          goto switchD_001359c0_caseD_37;
        case 1:
          goto switchD_001359c0_caseD_38;
        case 2:
          goto switchD_001359c0_caseD_39;
        case 3:
          goto switchD_001359c0_caseD_3a;
        case 4:
          local_40 = "PK - Given private key password does not allow for correct decryption";
          break;
        case 5:
          local_40 = "PK - Private key password can\'t be empty";
          break;
        case 6:
          goto switchD_001359c0_caseD_3d;
        default:
          goto switchD_001355c3_default;
        }
        goto LAB_00137120;
      case 0x3f:
        goto switchD_001359c0_caseD_3f;
      case 0x45:
        goto switchD_001359c0_caseD_45;
      case 0x46:
        goto switchD_001359c0_caseD_46;
      case 0x47:
        goto switchD_001359c0_caseD_47;
      case 0x48:
        goto switchD_001359c0_caseD_48;
      case 0x49:
        goto switchD_001359c0_caseD_49;
      case 0x4a:
        goto switchD_001359c0_caseD_4a;
      case 0x4b:
        goto switchD_001359c0_caseD_4b;
      case 0x4c:
        goto switchD_001359c0_caseD_4c;
      case 0x4d:
        goto switchD_001359c0_caseD_4d;
      }
      goto switchD_00138bce_default;
    }
    if (0x10ff < uVar5) {
      if (uVar5 != 0x1100) {
        if (uVar5 != 0x1180) goto LAB_001364e8;
        __format_02 = "PEM - Failed to allocate memory";
      }
LAB_0013571b:
      local_58 = "PKCS12 - PBE ASN.1 data not as expected";
      local_40 = "RSA - Input data contains invalid padding and is rejected";
      local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
      local_50 = "RSA - Bad input parameters to function";
      snprintf(buf,buflen,__format_02);
      if (uVar5 < 0x3c00) {
        if (uVar5 < 0x2f80) {
          if (uVar5 < 0x1f80) {
            if (uVar5 == 0x1e00) goto switchD_001359c0_caseD_0;
            if (uVar5 == 0x1e80) goto switchD_001359c0_caseD_1;
            if (uVar5 == 0x1f00) goto switchD_001359c0_caseD_2;
          }
          else if (uVar5 < 0x2e80) {
            if (uVar5 == 0x1f80) goto switchD_001359c0_caseD_3;
            if (uVar5 == 0x2e00) goto switchD_001359c0_caseD_20;
          }
          else {
            if (uVar5 == 0x2e80) goto switchD_001359c0_caseD_21;
            if (uVar5 == 0x2f00) goto switchD_001359c0_caseD_22;
          }
        }
        else if (uVar5 < 0x3a00) {
          if (uVar5 == 0x2f80) goto switchD_001359c0_caseD_23;
          if (uVar5 == 0x3900) goto switchD_001359c0_caseD_36;
          if (uVar5 == 0x3980) goto switchD_001359c0_caseD_37;
        }
        else if (uVar5 < 0x3b00) {
          if (uVar5 == 0x3a00) goto switchD_001359c0_caseD_38;
          if (uVar5 == 0x3a80) goto switchD_001359c0_caseD_39;
        }
        else {
          if (uVar5 == 0x3b00) goto switchD_001359c0_caseD_3a;
          if (uVar5 == 0x3b80) goto switchD_001359c0_caseD_3b;
        }
      }
      else if (uVar5 < 0x4100) {
        if (uVar5 < 0x3d80) {
          if (uVar5 == 0x3c00) goto switchD_001359c0_caseD_3c;
          if (uVar5 == 0x3c80) goto switchD_001359c0_caseD_3d;
          if (uVar5 == 0x3d00) goto switchD_001359c0_caseD_3e;
        }
        else if (uVar5 < 16000) {
          if (uVar5 == 0x3d80) goto switchD_001359c0_caseD_3f;
          if (uVar5 == 0x3e00) goto switchD_00135f02_caseD_3;
        }
        else {
          if (uVar5 == 16000) goto switchD_00135f02_caseD_4;
          if (uVar5 == 0x4080) goto switchD_001359c0_caseD_45;
        }
      }
      else if (uVar5 < 0x4300) {
        if (uVar5 < 0x4200) {
          if (uVar5 == 0x4100) goto switchD_001359c0_caseD_46;
          if (uVar5 == 0x4180) goto switchD_001359c0_caseD_47;
        }
        else {
          if (uVar5 == 0x4200) goto switchD_001359c0_caseD_48;
          if (uVar5 == 0x4280) goto switchD_001359c0_caseD_49;
        }
      }
      else if (uVar5 < 0x4400) {
        if (uVar5 == 0x4300) {
LAB_001362c7:
          pcVar4 = "RSA - The private key operation failed";
          goto LAB_0013914c;
        }
        if (uVar5 == 0x4380) goto switchD_001359c0_caseD_4b;
      }
      else {
        if (uVar5 == 0x4400) goto switchD_001359c0_caseD_4c;
        if (uVar5 == 0x4480) goto switchD_001359c0_caseD_4d;
      }
      goto LAB_0013678c;
    }
    if ((uVar1 & 0xff80) != 0) {
      if (uVar5 == 0x1080) {
        pcVar4 = "PEM - No PEM header or footer found";
        goto LAB_00136776;
      }
      goto LAB_001364e8;
    }
    goto LAB_00139184;
  }
  if (0x4d7f < uVar5) {
    if (uVar5 < 0x5200) {
      local_50 = "RSA - Bad input parameters to function";
      local_40 = "RSA - Input data contains invalid padding and is rejected";
      local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
      if (uVar5 < 0x4f80) {
        if (uVar5 < 0x4e80) {
          if (uVar5 == 0x4d80) goto LAB_00135fad;
          if (uVar5 == 0x4e00) {
            snprintf(buf,buflen,"ECP - The signature is not valid");
            goto LAB_001358ff;
          }
        }
        else {
          if (uVar5 == 0x4e80) {
            snprintf(buf,buflen,"ECP - Requested curve not available");
LAB_001353e5:
            local_40 = "RSA - Input data contains invalid padding and is rejected";
            local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
            local_50 = "RSA - Bad input parameters to function";
            switch(uVar5 - 0x3900 >> 7) {
            case 0:
              goto switchD_001359c0_caseD_36;
            case 1:
              goto switchD_001359c0_caseD_37;
            case 2:
              goto switchD_001359c0_caseD_38;
            case 3:
              goto switchD_001359c0_caseD_39;
            case 4:
              goto switchD_001359c0_caseD_3a;
            case 5:
              goto switchD_001359c0_caseD_3b;
            case 6:
              goto switchD_001359c0_caseD_3c;
            case 7:
              goto switchD_001359c0_caseD_3d;
            case 8:
              goto switchD_001359c0_caseD_3e;
            case 9:
              goto switchD_001359c0_caseD_3f;
            case 10:
              goto switchD_00135f02_caseD_3;
            case 0xb:
              goto switchD_00135f02_caseD_4;
            case 0xc:
              goto switchD_00135f02_caseD_5;
            case 0xd:
              goto switchD_001354af_caseD_b;
            case 0xf:
              goto switchD_001359c0_caseD_45;
            case 0x10:
              goto switchD_001359c0_caseD_46;
            case 0x11:
              goto switchD_001359c0_caseD_47;
            case 0x12:
              goto switchD_001359c0_caseD_48;
            case 0x13:
              goto switchD_001359c0_caseD_49;
            case 0x14:
              goto switchD_001359c0_caseD_4a;
            case 0x15:
              goto switchD_001359c0_caseD_4b;
            case 0x16:
              goto switchD_001359c0_caseD_4c;
            }
            goto switchD_00135406_caseD_e;
          }
          if (uVar5 == 0x4f00) {
            snprintf(buf,buflen,"ECP - The buffer is too small to write to");
            goto LAB_0013548e;
          }
        }
        goto LAB_001364e8;
      }
      if (0x50ff < uVar5) {
        if (uVar5 != 0x5100) {
          if (uVar5 == 0x5180) {
            pcVar4 = "MD - Failed to allocate memory";
            goto LAB_00136633;
          }
          goto LAB_001364e8;
        }
        snprintf(buf,buflen,"MD - Bad input parameters to function");
LAB_001358ff:
        switch(uVar5 - 0x3900 >> 7) {
        case 0:
          goto switchD_001359c0_caseD_36;
        case 1:
          goto switchD_001359c0_caseD_37;
        case 2:
          goto switchD_001359c0_caseD_38;
        case 3:
          goto switchD_001359c0_caseD_39;
        case 4:
          goto switchD_001359c0_caseD_3a;
        case 5:
          goto switchD_001359c0_caseD_3b;
        case 6:
          goto switchD_001359c0_caseD_3c;
        case 7:
          goto switchD_001359c0_caseD_3d;
        case 8:
          goto switchD_001359c0_caseD_3e;
        case 9:
          goto switchD_001359c0_caseD_3f;
        case 10:
          goto switchD_00135f02_caseD_3;
        case 0xb:
          goto switchD_00135f02_caseD_4;
        case 0xc:
          goto switchD_00135f02_caseD_5;
        case 0xd:
          goto switchD_001354af_caseD_b;
        }
        switch(uVar5 - 0x4080 >> 7) {
        case 0:
          goto switchD_001359c0_caseD_45;
        case 1:
          goto switchD_001359c0_caseD_46;
        case 2:
          goto switchD_001359c0_caseD_47;
        case 3:
          goto switchD_001359c0_caseD_48;
        case 4:
          goto switchD_001359c0_caseD_49;
        case 5:
          goto switchD_001359c0_caseD_4a;
        case 6:
          goto switchD_001359c0_caseD_4b;
        case 7:
          goto switchD_001359c0_caseD_4c;
        case 8:
          goto switchD_001359c0_caseD_4d;
        }
        goto switchD_00135e39_default;
      }
      if (uVar5 != 0x4f80) {
        if (uVar5 == 0x5080) {
          snprintf(buf,buflen,"MD - The selected feature is not available");
          goto LAB_001353e5;
        }
        goto LAB_001364e8;
      }
      snprintf(buf,buflen,"ECP - Bad input parameters to function");
LAB_0013548e:
      switch(uVar5 - 0x3a00 >> 7) {
      case 0:
        goto switchD_001359c0_caseD_38;
      case 1:
        goto switchD_001359c0_caseD_39;
      case 2:
        goto switchD_001359c0_caseD_3a;
      case 3:
        goto switchD_001359c0_caseD_3b;
      case 4:
        goto switchD_001359c0_caseD_3c;
      case 5:
        goto switchD_001359c0_caseD_3d;
      case 6:
        goto switchD_001359c0_caseD_3e;
      case 7:
        goto switchD_001359c0_caseD_3f;
      case 8:
        goto switchD_00135f02_caseD_3;
      case 9:
        goto switchD_00135f02_caseD_4;
      case 10:
        goto switchD_00135f02_caseD_5;
      case 0xb:
        goto switchD_001354af_caseD_b;
      }
switchD_001354af_default:
      local_40 = "RSA - Input data contains invalid padding and is rejected";
      local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
      local_50 = "RSA - Bad input parameters to function";
      switch(uVar5 - 0x3900 >> 7) {
      case 0:
        goto switchD_001359c0_caseD_36;
      case 1:
        goto switchD_001359c0_caseD_37;
      default:
        goto switchD_00136416_caseD_2;
      case 0xf:
        goto switchD_001359c0_caseD_45;
      case 0x10:
        goto switchD_001359c0_caseD_46;
      case 0x11:
switchD_001359c0_caseD_47:
        snprintf(buf,buflen,"RSA - Something failed during generation of a key");
        uVar2 = uVar5 - 0x4200 >> 7;
        if (uVar2 < 5) {
          (*(code *)(&DAT_0015a63c + *(int *)(&DAT_0015a63c + (ulong)uVar2 * 4)))();
          return;
        }
        break;
      case 0x12:
        goto switchD_001359c0_caseD_48;
      case 0x13:
switchD_001359c0_caseD_49:
        pcVar4 = "RSA - The public key operation failed";
        goto LAB_0013813b;
      case 0x14:
switchD_001359c0_caseD_4a:
        pcVar4 = "RSA - The private key operation failed";
        goto LAB_0013914c;
      case 0x15:
switchD_001359c0_caseD_4b:
        pcVar4 = "RSA - The PKCS#1 verification failed";
        goto LAB_00136776;
      case 0x16:
switchD_001359c0_caseD_4c:
        snprintf(buf,buflen,"RSA - The output buffer for decryption is not large enough");
        break;
      case 0x17:
        goto switchD_001359c0_caseD_4d;
      }
switchD_00135406_caseD_e:
      if (uVar5 == 0x4480) {
switchD_001359c0_caseD_4d:
        snprintf(buf,buflen,"RSA - The random generator failed to generate non-zeros");
        uVar2 = uVar5 - 0x7080 >> 7;
        if (uVar2 < 5) {
          (*(code *)(&DAT_0015a650 + *(int *)(&DAT_0015a650 + (ulong)uVar2 * 4)))();
          return;
        }
        goto LAB_0013680c;
      }
      goto LAB_00138fbc;
    }
    if (uVar5 < 0x6200) {
      if (0x60ff < uVar5) {
        if (uVar5 == 0x6100) {
          pcVar4 = "CIPHER - Bad input parameters to function";
          goto LAB_00136247;
        }
        if (uVar5 == 0x6180) {
          pcVar4 = "CIPHER - Failed to allocate memory";
          goto LAB_001368c7;
        }
        goto LAB_001364e8;
      }
      if (uVar5 != 0x5200) {
        if (uVar5 == 0x6080) {
          pcVar4 = "CIPHER - The selected feature is not available";
          goto LAB_0013914c;
        }
        goto LAB_001364e8;
      }
      snprintf(buf,buflen,"MD - Opening or reading of file failed");
LAB_00136649:
      switch(uVar5 - 0x6a00 >> 7) {
      case 0:
        goto switchD_00138515_caseD_2;
      case 1:
        goto switchD_00138515_caseD_3;
      case 2:
        goto switchD_001368ad_caseD_8;
      case 3:
        goto switchD_001380bf_caseD_0;
      case 4:
        goto switchD_0013807c_caseD_0;
      case 5:
        goto switchD_0013807c_caseD_1;
      case 6:
        goto switchD_0013807c_caseD_2;
      case 7:
        goto switchD_0013807c_caseD_3;
      case 8:
        goto switchD_001368ad_caseD_e;
      case 9:
        goto switchD_001368ad_caseD_f;
      case 10:
        goto switchD_001368ad_caseD_10;
      case 0xb:
        goto switchD_001368ad_caseD_11;
      default:
        goto switchD_0013666a_caseD_c;
      case 0xe:
switchD_0013666a_caseD_e:
        snprintf(buf,buflen,"SSL - Bad input parameters to function");
        uVar2 = uVar5 - 0x7180 >> 7;
        if (uVar2 < 5) {
          (*(code *)(&DAT_0015a714 + *(int *)(&DAT_0015a714 + (ulong)uVar2 * 4)))();
          return;
        }
        break;
      case 0xf:
switchD_0013666a_caseD_f:
        pcVar4 = "SSL - Verification of the message MAC failed";
LAB_00136776:
        snprintf(buf,buflen,pcVar4);
LAB_0013678c:
        switch(uVar5 - 0x7200 >> 7) {
        case 0:
          goto switchD_001367ad_caseD_0;
        case 1:
          goto switchD_001367ad_caseD_1;
        case 2:
          goto switchD_001367ad_caseD_2;
        case 3:
          goto switchD_001367ad_caseD_3;
        case 4:
          goto switchD_001367ad_caseD_4;
        case 5:
          goto switchD_001367ad_caseD_5;
        case 6:
          goto switchD_001367ad_caseD_6;
        case 7:
          goto switchD_001367ad_caseD_7;
        case 8:
          goto switchD_001367ad_caseD_8;
        case 9:
          goto switchD_001367ad_caseD_9;
        case 10:
          goto switchD_001367ad_caseD_a;
        case 0xb:
          goto switchD_001367ad_caseD_b;
        case 0xc:
          goto switchD_001367ad_caseD_c;
        case 0xd:
          goto switchD_001367ad_caseD_d;
        case 0xe:
          goto switchD_001367ad_caseD_e;
        case 0xf:
          goto switchD_001367ad_caseD_f;
        case 0x10:
          goto switchD_001367ad_caseD_10;
        case 0x11:
          goto switchD_001367ad_caseD_11;
        case 0x12:
          goto switchD_001367ad_caseD_12;
        case 0x13:
          goto switchD_001367ad_caseD_13;
        case 0x14:
          goto switchD_001367ad_caseD_14;
        case 0x15:
          goto switchD_001367ad_caseD_15;
        case 0x16:
          goto switchD_001367ad_caseD_16;
        case 0x17:
          goto switchD_001367ad_caseD_17;
        case 0x18:
          goto switchD_001367ad_caseD_18;
        }
        goto switchD_001367ad_default;
      case 0x10:
switchD_001367ad_caseD_0:
        snprintf(buf,buflen,"SSL - An invalid SSL record was received");
LAB_001367cc:
        switch(uVar5 - 0x6880 >> 7) {
        case 0:
          goto switchD_0013862d_caseD_2;
        case 1:
          goto switchD_0013862d_caseD_3;
        case 2:
          goto switchD_00138515_caseD_1;
        case 3:
          goto switchD_00138515_caseD_2;
        case 4:
          goto switchD_00138515_caseD_3;
        case 5:
          goto switchD_001368ad_caseD_8;
        case 6:
          goto switchD_001380bf_caseD_0;
        case 7:
          goto switchD_0013807c_caseD_0;
        case 8:
          goto switchD_0013807c_caseD_1;
        case 9:
          goto switchD_0013807c_caseD_2;
        case 10:
          goto switchD_0013807c_caseD_3;
        case 0xb:
          goto switchD_001368ad_caseD_e;
        case 0xc:
          goto switchD_001368ad_caseD_f;
        case 0xd:
          goto switchD_001368ad_caseD_10;
        case 0xe:
          goto switchD_001368ad_caseD_11;
        case 0x14:
          goto switchD_001367ad_caseD_1;
        case 0x15:
          goto switchD_001367ad_caseD_2;
        case 0x16:
          goto switchD_001367ad_caseD_3;
        case 0x17:
          goto switchD_001367ad_caseD_4;
        case 0x18:
          goto switchD_001367ad_caseD_5;
        case 0x19:
          goto switchD_001367ad_caseD_6;
        case 0x1a:
          goto switchD_001367ad_caseD_7;
        case 0x1b:
          goto switchD_001367ad_caseD_8;
        case 0x1c:
          goto switchD_001367ad_caseD_9;
        case 0x1d:
          goto switchD_001367ad_caseD_a;
        case 0x1e:
          goto switchD_001367ad_caseD_b;
        case 0x1f:
          goto switchD_001367ad_caseD_c;
        case 0x20:
          goto switchD_001367ad_caseD_d;
        case 0x21:
          goto switchD_001367ad_caseD_e;
        case 0x22:
          goto switchD_001367ad_caseD_f;
        case 0x23:
          goto switchD_001367ad_caseD_10;
        case 0x24:
          goto switchD_001367ad_caseD_11;
        case 0x25:
          goto switchD_001367ad_caseD_12;
        case 0x26:
          goto switchD_001367ad_caseD_13;
        case 0x27:
          goto switchD_001367ad_caseD_14;
        case 0x28:
          goto switchD_001367ad_caseD_15;
        case 0x29:
          goto switchD_001367ad_caseD_16;
        case 0x2a:
          goto switchD_001367ad_caseD_17;
        case 0x2b:
          goto switchD_001367ad_caseD_18;
        case 0x2c:
          goto switchD_001368ad_caseD_2f;
        case 0x2d:
          goto switchD_001368ad_caseD_30;
        case 0x2e:
          goto switchD_001368ad_caseD_31;
        }
        goto switchD_00138555_default;
      case 0x11:
switchD_001367ad_caseD_1:
        snprintf(buf,buflen,"SSL - The connection indicated an EOF");
LAB_0013680c:
        switch(uVar5 - 0x6800 >> 7) {
        case 0:
          goto switchD_0013862d_caseD_1;
        case 1:
          goto switchD_0013862d_caseD_2;
        case 2:
          goto switchD_0013862d_caseD_3;
        case 3:
          goto switchD_00138515_caseD_1;
        case 4:
          goto switchD_00138515_caseD_2;
        case 5:
          goto switchD_00138515_caseD_3;
        case 6:
          goto switchD_001368ad_caseD_8;
        case 7:
          goto switchD_001380bf_caseD_0;
        case 8:
          goto switchD_0013807c_caseD_0;
        case 9:
          goto switchD_0013807c_caseD_1;
        case 10:
          goto switchD_0013807c_caseD_2;
        case 0xb:
          goto switchD_0013807c_caseD_3;
        case 0xc:
          goto switchD_001368ad_caseD_e;
        case 0xd:
          goto switchD_001368ad_caseD_f;
        case 0xe:
          goto switchD_001368ad_caseD_10;
        case 0xf:
          goto switchD_001368ad_caseD_11;
        case 0x16:
          goto switchD_001367ad_caseD_2;
        case 0x17:
          goto switchD_001367ad_caseD_3;
        case 0x18:
          goto switchD_001367ad_caseD_4;
        case 0x19:
          goto switchD_001367ad_caseD_5;
        case 0x1a:
          goto switchD_001367ad_caseD_6;
        case 0x1b:
          goto switchD_001367ad_caseD_7;
        case 0x1c:
          goto switchD_001367ad_caseD_8;
        case 0x1d:
          goto switchD_001367ad_caseD_9;
        case 0x1e:
          goto switchD_001367ad_caseD_a;
        case 0x1f:
          goto switchD_001367ad_caseD_b;
        case 0x20:
          goto switchD_001367ad_caseD_c;
        case 0x21:
          goto switchD_001367ad_caseD_d;
        case 0x22:
          goto switchD_001367ad_caseD_e;
        case 0x23:
          goto switchD_001367ad_caseD_f;
        case 0x24:
          goto switchD_001367ad_caseD_10;
        case 0x25:
          goto switchD_001367ad_caseD_11;
        case 0x26:
          goto switchD_001367ad_caseD_12;
        case 0x27:
          goto switchD_001367ad_caseD_13;
        case 0x28:
          goto switchD_001367ad_caseD_14;
        case 0x29:
          goto switchD_001367ad_caseD_15;
        case 0x2a:
          goto switchD_001367ad_caseD_16;
        case 0x2b:
          goto switchD_001367ad_caseD_17;
        case 0x2c:
          goto switchD_001367ad_caseD_18;
        case 0x2d:
          goto switchD_001368ad_caseD_2f;
        case 0x2e:
          goto switchD_001368ad_caseD_30;
        case 0x2f:
          goto switchD_001368ad_caseD_31;
        }
        goto switchD_0013682d_caseD_10;
      case 0x12:
switchD_001367ad_caseD_2:
        pcVar4 = "SSL - An unknown cipher was received";
        goto LAB_00136836;
      case 0x13:
switchD_001367ad_caseD_3:
        snprintf(buf,buflen,"SSL - The server has no ciphersuites in common with the client");
        break;
      case 0x14:
        goto switchD_001367ad_caseD_4;
      case 0x15:
        goto switchD_001367ad_caseD_5;
      case 0x16:
        goto switchD_001367ad_caseD_6;
      case 0x17:
        goto switchD_001367ad_caseD_7;
      case 0x18:
        goto switchD_001367ad_caseD_8;
      case 0x19:
        goto switchD_001367ad_caseD_9;
      case 0x1a:
        goto switchD_001367ad_caseD_a;
      case 0x1b:
        goto switchD_001367ad_caseD_b;
      case 0x1c:
        goto switchD_001367ad_caseD_c;
      case 0x1d:
        goto switchD_001367ad_caseD_d;
      case 0x1e:
        goto switchD_001367ad_caseD_e;
      case 0x1f:
        goto switchD_001367ad_caseD_f;
      case 0x20:
        goto switchD_001367ad_caseD_10;
      case 0x21:
        goto switchD_001367ad_caseD_11;
      case 0x22:
        goto switchD_001367ad_caseD_12;
      case 0x23:
        goto switchD_001367ad_caseD_13;
      case 0x24:
        goto switchD_001367ad_caseD_14;
      case 0x25:
        goto switchD_001367ad_caseD_15;
      case 0x26:
        goto switchD_001367ad_caseD_16;
      case 0x27:
        goto switchD_001367ad_caseD_17;
      case 0x28:
        goto switchD_001367ad_caseD_18;
      case 0x29:
        goto switchD_001368ad_caseD_2f;
      case 0x2a:
        goto switchD_001368ad_caseD_30;
      case 0x2b:
        goto switchD_001368ad_caseD_31;
      }
      switch(uVar5 - 0x6700 >> 7) {
      case 0:
        goto switchD_001368ad_caseD_0;
      case 1:
        goto switchD_0013862d_caseD_0;
      case 2:
        goto switchD_0013862d_caseD_1;
      case 3:
        goto switchD_0013862d_caseD_2;
      case 4:
        goto switchD_0013862d_caseD_3;
      case 5:
        goto switchD_00138515_caseD_1;
      case 6:
        goto switchD_00138515_caseD_2;
      case 7:
        goto switchD_00138515_caseD_3;
      case 8:
        goto switchD_001368ad_caseD_8;
      case 9:
        goto switchD_001380bf_caseD_0;
      case 10:
        goto switchD_0013807c_caseD_0;
      case 0xb:
        goto switchD_0013807c_caseD_1;
      case 0xc:
        goto switchD_0013807c_caseD_2;
      case 0xd:
        goto switchD_0013807c_caseD_3;
      case 0xe:
        goto switchD_001368ad_caseD_e;
      case 0xf:
        goto switchD_001368ad_caseD_f;
      case 0x10:
        goto switchD_001368ad_caseD_10;
      case 0x11:
        goto switchD_001368ad_caseD_11;
      case 0x1a:
switchD_001367ad_caseD_4:
        pcVar4 = "SSL - No RNG was provided to the SSL module";
        goto LAB_00136247;
      case 0x1b:
        goto switchD_001367ad_caseD_5;
      case 0x1c:
        goto switchD_001367ad_caseD_6;
      case 0x1d:
        goto switchD_001367ad_caseD_7;
      case 0x1e:
        goto switchD_001367ad_caseD_8;
      case 0x1f:
        goto switchD_001367ad_caseD_9;
      case 0x20:
        goto switchD_001367ad_caseD_a;
      case 0x21:
        goto switchD_001367ad_caseD_b;
      case 0x22:
        goto switchD_001367ad_caseD_c;
      case 0x23:
        goto switchD_001367ad_caseD_d;
      case 0x24:
        goto switchD_001367ad_caseD_e;
      case 0x25:
        goto switchD_001367ad_caseD_f;
      case 0x26:
        goto switchD_001367ad_caseD_10;
      case 0x27:
        goto switchD_001367ad_caseD_11;
      case 0x28:
        goto switchD_001367ad_caseD_12;
      case 0x29:
        goto switchD_001367ad_caseD_13;
      case 0x2a:
        goto switchD_001367ad_caseD_14;
      case 0x2b:
        goto switchD_001367ad_caseD_15;
      case 0x2c:
        goto switchD_001367ad_caseD_16;
      case 0x2d:
        goto switchD_001367ad_caseD_17;
      case 0x2e:
        goto switchD_001367ad_caseD_18;
      case 0x2f:
        goto switchD_001368ad_caseD_2f;
      case 0x30:
        goto switchD_001368ad_caseD_30;
      case 0x31:
        goto switchD_001368ad_caseD_31;
      }
      goto switchD_001368ad_caseD_12;
    }
    if (uVar5 < 0x6300) {
      if (uVar5 != 0x6200) {
        if (uVar5 != 0x6280) goto LAB_001364e8;
        pcVar4 = "CIPHER - Decryption of block requires a full block";
        goto LAB_0013914c;
      }
      pcVar4 = "CIPHER - Input data contains invalid padding and is rejected";
      goto LAB_00136776;
    }
    if (uVar5 != 0x6300) {
      if (uVar5 == 0x6380) {
        pcVar4 = "CIPHER - The context is invalid, eg because it was free()ed";
        goto LAB_00138feb;
      }
      goto LAB_001364e8;
    }
    pcVar4 = "CIPHER - Authentication failed (for AEAD modes)";
    goto LAB_00138c1c;
  }
  if (0x3f7f < uVar5) {
    local_40 = "RSA - Input data contains invalid padding and is rejected";
    if (uVar5 < 0x4200) {
      if (uVar5 < 0x4100) {
        local_50 = "RSA - Bad input parameters to function";
        if (uVar5 != 0x3f80) {
          if (uVar5 != 0x4080) goto LAB_001364e8;
          goto switchD_001359c0_caseD_45;
        }
switchD_001354af_caseD_b:
        snprintf(buf,buflen,"PK - Memory allocation failed");
        switch(uVar5 - 0x3c80 >> 7) {
        case 0:
          goto switchD_001359c0_caseD_3d;
        case 1:
          goto switchD_001359c0_caseD_3e;
        case 2:
          goto switchD_001359c0_caseD_3f;
        case 3:
switchD_00135f02_caseD_3:
          __format = "PK - Read/write of file failed";
          goto LAB_00135982;
        case 4:
          goto switchD_00135f02_caseD_4;
        case 5:
switchD_00135f02_caseD_5:
          __format_02 = "PK - Type mismatch, eg attempt to encrypt with an ECDSA key";
          goto LAB_0013571b;
        }
        goto switchD_00135f02_default;
      }
      if (uVar5 != 0x4100) {
        if (uVar5 != 0x4180) goto LAB_001364e8;
        goto switchD_001359c0_caseD_47;
      }
switchD_001359c0_caseD_46:
      goto LAB_00137120;
    }
    if (uVar5 < 0x4c80) {
      if (uVar5 != 0x4200) {
        if (uVar5 == 0x4c00) {
          snprintf(buf,buflen,"ECP - Signature is valid but shorter than the user-supplied length");
          goto LAB_0013548e;
        }
        goto LAB_001364e8;
      }
switchD_001359c0_caseD_48:
      snprintf(buf,buflen,"RSA - Key failed to pass the library\'s validity check");
      goto LAB_001364e8;
    }
    if (uVar5 == 0x4c80) {
LAB_0013639c:
      local_40 = "RSA - Input data contains invalid padding and is rejected";
      local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
      local_50 = "RSA - Bad input parameters to function";
      snprintf(buf,buflen,__format_03);
      switch(uVar5 - 0x3900 >> 7) {
      case 0:
        goto switchD_001359c0_caseD_36;
      case 1:
        goto switchD_001359c0_caseD_37;
      case 2:
        goto switchD_001359c0_caseD_38;
      case 0xf:
        goto switchD_001359c0_caseD_45;
      case 0x10:
        goto switchD_001359c0_caseD_46;
      case 0x11:
        goto switchD_001359c0_caseD_47;
      case 0x12:
        goto switchD_001359c0_caseD_48;
      case 0x13:
        goto switchD_001359c0_caseD_49;
      case 0x14:
        goto switchD_001359c0_caseD_4a;
      case 0x15:
        goto switchD_001359c0_caseD_4b;
      case 0x16:
        goto switchD_001359c0_caseD_4c;
      case 0x17:
        goto switchD_001359c0_caseD_4d;
      }
      goto switchD_001363d6_caseD_3;
    }
    if (uVar5 != 0x4d00) goto LAB_001364e8;
LAB_00135844:
    local_40 = "RSA - Input data contains invalid padding and is rejected";
    local_48 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
    local_50 = "RSA - Bad input parameters to function";
    snprintf(buf,buflen,__format_01);
    switch(uVar5 - 0x3900 >> 7) {
    case 0:
      goto switchD_001359c0_caseD_36;
    case 1:
      goto switchD_001359c0_caseD_37;
    case 2:
      goto switchD_001359c0_caseD_38;
    case 3:
      goto switchD_001359c0_caseD_39;
    case 0xf:
      goto switchD_001359c0_caseD_45;
    case 0x10:
      goto switchD_001359c0_caseD_46;
    case 0x11:
      goto switchD_001359c0_caseD_47;
    case 0x12:
      goto switchD_001359c0_caseD_48;
    case 0x13:
      goto switchD_001359c0_caseD_49;
    case 0x14:
      goto switchD_001359c0_caseD_4a;
    case 0x15:
      goto switchD_001359c0_caseD_4b;
    case 0x16:
      goto switchD_001359c0_caseD_4c;
    case 0x17:
      goto switchD_001359c0_caseD_4d;
    }
switchD_0013587e_caseD_4:
    if (0x67ff < uVar5) {
      if (0x6bff < uVar5) {
        if (uVar5 < 0x6e00) {
          if (uVar5 < 0x6d00) {
            if (uVar5 == 0x6c00) goto switchD_0013807c_caseD_0;
LAB_0013760b:
            if (uVar5 == 0x6c80) goto switchD_0013807c_caseD_1;
          }
          else {
LAB_00137a4d:
            if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
            if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
          }
          goto LAB_00138fbc;
        }
LAB_001376ef:
        if (uVar5 < 0x6f00) {
          if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
          if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
          goto LAB_00138fbc;
        }
        if (uVar5 != 0x6f00) {
          if (uVar5 == 0x6f80) goto switchD_001368ad_caseD_11;
          goto LAB_00138fbc;
        }
        goto LAB_00137ce2;
      }
LAB_0013754c:
      if (uVar5 < 0x6a00) {
        if (uVar5 < 0x6900) {
          if (uVar5 == 0x6800) goto switchD_0013862d_caseD_1;
          if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
        }
        else {
          if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
          if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
        }
      }
      else if (uVar5 < 0x6b00) {
        if (uVar5 == 0x6a00) goto switchD_00138515_caseD_2;
        if (uVar5 == 0x6a80) goto switchD_00138515_caseD_3;
      }
      else {
        if (uVar5 == 0x6b00) goto switchD_001368ad_caseD_8;
        if (uVar5 == 0x6b80) goto switchD_001380bf_caseD_0;
      }
      goto LAB_00138fbc;
    }
LAB_00137505:
    if (uVar5 < 0x2480) {
      if (uVar5 < 0x2280) {
        if (uVar5 < 0x2180) {
          if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
          if (uVar5 == 0x2100) goto switchD_00138b8e_caseD_0;
          goto LAB_00138fbc;
        }
        if (uVar5 == 0x2180) goto switchD_00138bce_caseD_0;
        if (uVar5 != 0x2200) goto LAB_00138fbc;
        goto switchD_00138c0e_caseD_0;
      }
      if (uVar5 < 0x2380) {
        if (uVar5 != 0x2280) {
          if (uVar5 == 0x2300) goto switchD_00138c51_caseD_1;
          goto LAB_00138fbc;
        }
        goto switchD_00138c51_caseD_0;
      }
      if (uVar5 != 0x2380) {
        if (uVar5 == 0x2400) goto switchD_00138c51_caseD_3;
        goto LAB_00138fbc;
      }
      goto switchD_00138c51_caseD_2;
    }
    if (0x65ff < uVar5) {
      if (uVar5 < 0x6700) {
        if (uVar5 == 0x6600) goto switchD_001368f9_caseD_0;
        if (uVar5 == 0x6680) goto switchD_001368f9_caseD_1;
        goto LAB_00138fbc;
      }
      if (uVar5 != 0x6700) {
        if (uVar5 == 0x6780) goto switchD_0013862d_caseD_0;
        goto LAB_00138fbc;
      }
      goto switchD_001368ad_caseD_0;
    }
    if (uVar5 < 0x2580) {
      if (uVar5 == 0x2480) goto switchD_00138eda_caseD_0;
      if (uVar5 == 0x2500) goto switchD_00138f1a_caseD_0;
      goto LAB_00138fbc;
    }
    if (uVar5 != 0x2580) {
      if (uVar5 != 0x2600) goto LAB_00138fbc;
      goto switchD_00138f5a_caseD_1;
    }
    goto switchD_00138f5a_caseD_0;
  }
  if (0x3d7f < uVar5) {
    if (uVar5 < 16000) {
      if (uVar5 == 0x3d80) {
switchD_001359c0_caseD_3f:
        __format_00 = "PK - Unsupported key version";
        goto LAB_00135fad;
      }
      if (uVar5 == 0x3e00) goto switchD_00135f02_caseD_3;
    }
    else {
      if (uVar5 == 16000) {
switchD_00135f02_caseD_4:
        pcVar4 = "PK - Bad input parameters to function";
        goto LAB_00135f0b;
      }
      if (uVar5 == 0x3f00) goto switchD_00135f02_caseD_5;
    }
LAB_001364e8:
    if (uVar5 < 0x7580) {
      if (0x6f7f < uVar5) {
        if (uVar5 < 0x7280) {
          if (uVar5 < 0x7100) {
            if (uVar5 == 0x6f80) goto switchD_001368ad_caseD_11;
            if (uVar5 == 0x7080) {
              pcVar4 = "SSL - The requested feature is not available";
              goto LAB_00136633;
            }
          }
          else {
            if (uVar5 == 0x7100) goto switchD_0013666a_caseD_e;
            if (uVar5 == 0x7180) goto switchD_0013666a_caseD_f;
            if (uVar5 == 0x7200) goto switchD_001367ad_caseD_0;
          }
        }
        else if (uVar5 < 0x7400) {
          if (uVar5 == 0x7280) goto switchD_001367ad_caseD_1;
          if (uVar5 == 0x7300) goto switchD_001367ad_caseD_2;
          if (uVar5 == 0x7380) goto switchD_001367ad_caseD_3;
        }
        else {
          if (uVar5 == 0x7400) {
            pcVar4 = "SSL - No RNG was provided to the SSL module";
            goto LAB_00136247;
          }
          if (uVar5 == 0x7480) {
            pcVar4 = 
            "SSL - No client certification received from the client, but required by the authentication mode"
            ;
            goto LAB_001368c7;
          }
          if (uVar5 == 0x7500) goto switchD_001367ad_caseD_6;
        }
        goto LAB_001380de;
      }
      if (uVar5 < 0x6d00) {
        if (uVar5 < 0x4380) {
          if (uVar5 == 0x4280) goto switchD_001359c0_caseD_49;
          if (uVar5 == 0x4300) goto switchD_001359c0_caseD_4a;
        }
        else {
          if (uVar5 == 0x4380) goto switchD_001359c0_caseD_4b;
          if (uVar5 == 0x4400) goto switchD_001359c0_caseD_4c;
          if (uVar5 == 0x4480) goto switchD_001359c0_caseD_4d;
        }
        goto LAB_001380de;
      }
      if (uVar5 < 0x6e00) {
        if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
        if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
        goto LAB_001380de;
      }
      if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
      if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
      if (uVar5 != 0x6f00) goto LAB_001380de;
      goto LAB_00137ce2;
    }
    if (uVar5 < 0x7a80) {
      if (uVar5 < 0x7800) {
        if (uVar5 < 0x7680) {
          if (uVar5 == 0x7580) goto switchD_001367ad_caseD_7;
          if (uVar5 == 0x7600) goto switchD_001367ad_caseD_8;
        }
        else {
          if (uVar5 == 0x7680) goto switchD_001367ad_caseD_9;
          if (uVar5 == 0x7700) goto switchD_001367ad_caseD_a;
          if (uVar5 == 0x7780) goto switchD_001367ad_caseD_b;
        }
      }
      else if (uVar5 < 0x7900) {
        if (uVar5 == 0x7800) goto switchD_001367ad_caseD_c;
        if (uVar5 == 0x7880) goto switchD_001367ad_caseD_d;
      }
      else {
        if (uVar5 == 0x7900) goto switchD_001367ad_caseD_e;
        if (uVar5 == 0x7980) goto switchD_001367ad_caseD_f;
        if (uVar5 == 0x7a00) goto switchD_001367ad_caseD_10;
      }
    }
    else if (uVar5 < 32000) {
      if (uVar5 < 0x7b80) {
        if (uVar5 == 0x7a80) goto switchD_001367ad_caseD_11;
        if (uVar5 == 0x7b00) goto switchD_001367ad_caseD_12;
      }
      else {
        if (uVar5 == 0x7b80) goto switchD_001367ad_caseD_13;
        if (uVar5 == 0x7c00) goto switchD_001367ad_caseD_14;
        if (uVar5 == 0x7c80) goto switchD_001367ad_caseD_15;
      }
    }
    else {
      if (uVar5 < 0x7e80) {
        if (uVar5 == 32000) {
          local_40 = 
          "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Calculate Secret"
          ;
        }
        else {
          if (uVar5 != 0x7d80) {
            if (uVar5 == 0x7e00) goto switchD_001367ad_caseD_18;
            goto LAB_001380de;
          }
          local_40 = "SSL - Processing of the CertificateVerify handshake message failed";
        }
        goto LAB_00137120;
      }
      if (uVar5 == 0x7e80) {
        pcVar4 = "SSL - Processing of the Finished handshake message failed";
        goto LAB_0013914c;
      }
      if (uVar5 == 0x7f00) {
        local_58 = "SSL - Memory allocation failed";
        goto switchD_001359c0_caseD_1;
      }
      if (uVar5 == 0x7f80) {
        pcVar4 = "SSL - Hardware acceleration function returned with error";
        goto LAB_00138fa8;
      }
    }
    goto LAB_001380de;
  }
  if (uVar5 < 0x3c80) {
    if (uVar5 == 0x3b80) {
switchD_001359c0_caseD_3b:
      pcVar4 = "PK - Given private key password does not allow for correct decryption";
      goto LAB_0013914c;
    }
    if (uVar5 == 0x3c00) goto switchD_001359c0_caseD_3c;
    goto LAB_001364e8;
  }
  if (uVar5 != 0x3c80) {
    if (uVar5 == 0x3d00) goto switchD_001359c0_caseD_3e;
    goto LAB_001364e8;
  }
switchD_001359c0_caseD_3d:
  pcVar4 = "PK - Key algorithm is unsupported (only RSA and EC are supported)";
LAB_00136247:
  snprintf(buf,buflen,pcVar4);
switchD_00135f02_default:
  switch(uVar5 - 0x6680 >> 7) {
  case 0:
    goto switchD_001368f9_caseD_1;
  case 1:
    goto switchD_001368ad_caseD_0;
  case 2:
    goto switchD_0013862d_caseD_0;
  case 3:
    goto switchD_0013862d_caseD_1;
  case 4:
    goto switchD_0013862d_caseD_2;
  case 5:
    goto switchD_0013862d_caseD_3;
  case 6:
    goto switchD_00138515_caseD_1;
  case 7:
    goto switchD_00138515_caseD_2;
  case 8:
    goto switchD_00138515_caseD_3;
  case 9:
    goto switchD_001368ad_caseD_8;
  case 10:
    goto switchD_001380bf_caseD_0;
  case 0xb:
    goto switchD_0013807c_caseD_0;
  case 0xc:
    goto switchD_0013807c_caseD_1;
  case 0xd:
    goto switchD_0013807c_caseD_2;
  case 0xe:
    goto switchD_0013807c_caseD_3;
  case 0xf:
    goto switchD_001368ad_caseD_e;
  case 0x10:
    goto switchD_001368ad_caseD_f;
  case 0x11:
    goto switchD_001368ad_caseD_10;
  case 0x12:
    goto switchD_001368ad_caseD_11;
  default:
    goto switchD_00136279_caseD_13;
  case 0x1c:
switchD_001367ad_caseD_5:
    pcVar4 = 
    "SSL - No client certification received from the client, but required by the authentication mode"
    ;
LAB_001368c7:
    snprintf(buf,buflen,pcVar4);
    switch(uVar5 - 0x6600 >> 7) {
    case 0:
      goto switchD_001368f9_caseD_0;
    case 1:
      goto switchD_001368f9_caseD_1;
    case 2:
      goto switchD_001368ad_caseD_0;
    case 3:
      goto switchD_0013862d_caseD_0;
    case 4:
      goto switchD_0013862d_caseD_1;
    case 5:
      goto switchD_0013862d_caseD_2;
    case 6:
      goto switchD_0013862d_caseD_3;
    case 7:
      goto switchD_00138515_caseD_1;
    case 8:
      goto switchD_00138515_caseD_2;
    case 9:
      goto switchD_00138515_caseD_3;
    case 10:
      goto switchD_001368ad_caseD_8;
    case 0xb:
      goto switchD_001380bf_caseD_0;
    case 0xc:
      goto switchD_0013807c_caseD_0;
    case 0xd:
      goto switchD_0013807c_caseD_1;
    case 0xe:
      goto switchD_0013807c_caseD_2;
    case 0xf:
      goto switchD_0013807c_caseD_3;
    case 0x10:
      goto switchD_001368ad_caseD_e;
    case 0x11:
      goto switchD_001368ad_caseD_f;
    case 0x12:
      goto switchD_001368ad_caseD_10;
    case 0x13:
      goto switchD_001368ad_caseD_11;
    case 0x1e:
      goto switchD_001367ad_caseD_6;
    case 0x1f:
      goto switchD_001367ad_caseD_7;
    case 0x20:
      goto switchD_001367ad_caseD_8;
    case 0x21:
      goto switchD_001367ad_caseD_9;
    case 0x22:
      goto switchD_001367ad_caseD_a;
    case 0x23:
switchD_001367ad_caseD_b:
      snprintf(buf,buflen,"SSL - A fatal alert message was received from our peer");
      return;
    case 0x24:
      goto switchD_001367ad_caseD_c;
    case 0x25:
      goto switchD_001367ad_caseD_d;
    case 0x26:
      goto switchD_001367ad_caseD_e;
    case 0x27:
      goto switchD_001367ad_caseD_f;
    case 0x28:
      goto switchD_001367ad_caseD_10;
    case 0x29:
      goto switchD_001367ad_caseD_11;
    case 0x2a:
      goto switchD_001367ad_caseD_12;
    case 0x2b:
      goto switchD_001367ad_caseD_13;
    case 0x2c:
      goto switchD_001367ad_caseD_14;
    case 0x2d:
      goto switchD_001367ad_caseD_15;
    case 0x2e:
      goto switchD_001367ad_caseD_16;
    case 0x2f:
      goto switchD_001367ad_caseD_17;
    case 0x30:
      goto switchD_001367ad_caseD_18;
    case 0x31:
      goto switchD_001368ad_caseD_2f;
    case 0x32:
      goto switchD_001368ad_caseD_30;
    case 0x33:
      goto switchD_001368ad_caseD_31;
    }
    goto switchD_001368f9_caseD_14;
  case 0x1d:
switchD_001367ad_caseD_6:
    snprintf(buf,buflen,"SSL - Our own certificate(s) is/are too large to send in an SSL message");
    uVar2 = uVar5 - 0x7580 >> 7;
    if (uVar2 < 5) {
      (*(code *)(&DAT_0015ac30 + *(int *)(&DAT_0015ac30 + (ulong)uVar2 * 4)))();
      return;
    }
    if (uVar5 < 0x6980) {
      if (0x65ff < uVar5) {
        if (uVar5 < 0x6780) {
          if (uVar5 == 0x6600) goto switchD_001368f9_caseD_0;
          if (uVar5 == 0x6680) goto switchD_001368f9_caseD_1;
          if (uVar5 == 0x6700) goto switchD_001368ad_caseD_0;
        }
        else if (uVar5 < 0x6880) {
          if (uVar5 == 0x6780) goto switchD_0013862d_caseD_0;
          if (uVar5 == 0x6800) goto switchD_0013862d_caseD_1;
        }
        else {
          if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
          if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
        }
        goto switchD_00138bce_default;
      }
      if (uVar5 < 0x2200) {
        if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
        if (uVar5 == 0x2100) goto switchD_00138b8e_caseD_0;
        if (uVar5 != 0x2180) goto switchD_00138bce_default;
        goto switchD_00138bce_caseD_0;
      }
      if (uVar5 == 0x2200) goto switchD_00138c0e_caseD_0;
      if (uVar5 == 0x2280) goto switchD_00138c51_caseD_0;
      if (uVar5 != 0x2300) goto switchD_00138bce_default;
      goto switchD_00138c51_caseD_1;
    }
    if (0x6c7f < uVar5) {
      if (uVar5 < 0x6e00) {
        if (uVar5 == 0x6c80) goto switchD_0013807c_caseD_1;
        if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
        if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
        goto switchD_00138bce_default;
      }
      if (uVar5 < 0x6f00) {
        if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
        if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
        goto switchD_00138bce_default;
      }
      if (uVar5 != 0x6f00) {
        if (uVar5 == 0x6f80) goto switchD_001368ad_caseD_11;
        goto switchD_00138bce_default;
      }
      goto LAB_00137ce2;
    }
    if (uVar5 < 0x6b00) {
      if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
      if (uVar5 == 0x6a00) goto switchD_00138515_caseD_2;
      if (uVar5 == 0x6a80) goto switchD_00138515_caseD_3;
    }
    else {
      if (uVar5 == 0x6b00) goto switchD_001368ad_caseD_8;
      if (uVar5 == 0x6b80) goto switchD_001380bf_caseD_0;
      if (uVar5 == 0x6c00) goto switchD_0013807c_caseD_0;
    }
    goto switchD_00138bce_default;
  case 0x1e:
switchD_001367ad_caseD_7:
    snprintf(buf,buflen,"SSL - The own certificate is not set, but needed by the server");
    uVar2 = uVar5 - 0x7600 >> 7;
    if (uVar2 < 5) {
      (*(code *)(&DAT_0015ac44 + *(int *)(&DAT_0015ac44 + (ulong)uVar2 * 4)))();
      return;
    }
    break;
  case 0x1f:
switchD_001367ad_caseD_8:
    snprintf(buf,buflen,"SSL - The own private key or pre-shared key is not set, but needed");
    uVar2 = uVar5 - 0x7680 >> 7;
    if (uVar2 < 4) {
      (*(code *)(&DAT_0015ac58 + *(int *)(&DAT_0015ac58 + (ulong)uVar2 * 4)))();
      return;
    }
    break;
  case 0x20:
switchD_001367ad_caseD_9:
    snprintf(buf,buflen,"SSL - No CA Chain is set, but required to operate");
    uVar2 = uVar5 - 0x7700 >> 7;
    if (uVar2 < 4) {
      (*(code *)(&DAT_0015ac68 + *(int *)(&DAT_0015ac68 + (ulong)uVar2 * 4)))();
      return;
    }
    goto LAB_00136c26;
  case 0x21:
switchD_001367ad_caseD_a:
    snprintf(buf,buflen,"SSL - An unexpected message was received from our peer");
    uVar2 = uVar5 - 0x7780 >> 7;
    if (uVar2 < 4) {
      (*(code *)(&DAT_0015ac78 + *(int *)(&DAT_0015ac78 + (ulong)uVar2 * 4)))();
      return;
    }
    goto LAB_00136c91;
  case 0x22:
    goto switchD_001367ad_caseD_b;
  case 0x23:
switchD_001367ad_caseD_c:
    snprintf(buf,buflen,"SSL - Verification of our peer failed");
    break;
  case 0x24:
    goto switchD_001367ad_caseD_d;
  case 0x25:
    goto switchD_001367ad_caseD_e;
  case 0x26:
    goto switchD_001367ad_caseD_f;
  case 0x27:
    goto switchD_001367ad_caseD_10;
  case 0x28:
    goto switchD_001367ad_caseD_11;
  case 0x29:
    goto switchD_001367ad_caseD_12;
  case 0x2a:
    goto switchD_001367ad_caseD_13;
  case 0x2b:
    goto switchD_001367ad_caseD_14;
  case 0x2c:
    goto switchD_001367ad_caseD_15;
  case 0x2d:
    goto switchD_001367ad_caseD_16;
  case 0x2e:
    goto switchD_001367ad_caseD_17;
  case 0x2f:
    goto switchD_001367ad_caseD_18;
  case 0x30:
    goto switchD_001368ad_caseD_2f;
  case 0x31:
    goto switchD_001368ad_caseD_30;
  case 0x32:
    goto switchD_001368ad_caseD_31;
  }
  switch(uVar5 - 0x6780 >> 7) {
  case 0:
    goto switchD_0013862d_caseD_0;
  case 1:
    goto switchD_0013862d_caseD_1;
  case 2:
    goto switchD_0013862d_caseD_2;
  case 3:
    goto switchD_0013862d_caseD_3;
  case 4:
    goto switchD_00138515_caseD_1;
  case 5:
    goto switchD_00138515_caseD_2;
  case 6:
    goto switchD_00138515_caseD_3;
  case 7:
    goto switchD_001368ad_caseD_8;
  case 8:
    goto switchD_001380bf_caseD_0;
  case 9:
    goto switchD_0013807c_caseD_0;
  case 10:
    goto switchD_0013807c_caseD_1;
  case 0xb:
    goto switchD_0013807c_caseD_2;
  case 0xc:
    goto switchD_0013807c_caseD_3;
  case 0xd:
    goto switchD_001368ad_caseD_e;
  case 0xe:
    goto switchD_001368ad_caseD_f;
  case 0xf:
switchD_001368ad_caseD_10:
    snprintf(buf,buflen,"SSL - Processing of the compression / decompression failed");
    if (0x297f < uVar5) {
      if (0x69ff < uVar5) {
        if (0x6c7f < uVar5) {
          if (0x6d7f < uVar5) {
            if (uVar5 != 0x6d80) {
              if (uVar5 != 0x6e00) {
                if (uVar5 != 0x6e80) goto switchD_001390aa_default;
                goto switchD_001368ad_caseD_f;
              }
              goto switchD_001368ad_caseD_e;
            }
            goto switchD_0013807c_caseD_3;
          }
          goto LAB_00137176;
        }
        if (0x6aff < uVar5) {
          if (uVar5 == 0x6b00) goto switchD_001368ad_caseD_8;
          goto LAB_00138204;
        }
        goto LAB_00138386;
      }
      if (uVar5 < 0x6780) goto LAB_00138480;
      if (0x687f < uVar5) {
        if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
        goto LAB_001385dd;
      }
      goto LAB_0013876d;
    }
    if (uVar5 < 0x2500) goto LAB_00137c79;
    if (0x26ff < uVar5) {
      if (0x27ff < uVar5) goto LAB_00138c96;
      goto LAB_00138a66;
    }
    if (0x25ff < uVar5) goto LAB_00138465;
    goto LAB_001388cb;
  case 0x10:
    goto switchD_001368ad_caseD_11;
  default:
    goto switchD_0013862d_default;
  case 0x22:
switchD_001367ad_caseD_d:
    snprintf(buf,buflen,"SSL - The peer notified us that the connection is going to be closed");
LAB_00136c26:
    if (uVar5 < 0x6900) {
      if (uVar5 < 0x2400) {
        if (uVar5 < 0x2200) {
          if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
          if (uVar5 != 0x2100) {
            if (uVar5 == 0x2180) goto switchD_00138bce_caseD_0;
            goto LAB_00138eb9;
          }
          goto switchD_00138b8e_caseD_0;
        }
        if (uVar5 < 0x2300) {
          if (uVar5 != 0x2200) {
            if (uVar5 == 0x2280) goto switchD_00138c51_caseD_0;
            goto LAB_00138eb9;
          }
          goto LAB_00138c75;
        }
        if (uVar5 != 0x2300) {
          if (uVar5 == 0x2380) goto switchD_00138c51_caseD_2;
          goto LAB_00138eb9;
        }
        goto switchD_00138c51_caseD_1;
      }
      if (0x66ff < uVar5) {
        if (uVar5 < 0x6800) {
          if (uVar5 == 0x6700) goto switchD_001368ad_caseD_0;
          if (uVar5 == 0x6780) goto switchD_0013862d_caseD_0;
        }
        else {
          if (uVar5 == 0x6800) goto switchD_0013862d_caseD_1;
          if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
        }
        goto LAB_00138eb9;
      }
      if (uVar5 != 0x2400) {
        if (uVar5 != 0x6600) {
          if (uVar5 == 0x6680) goto switchD_001368f9_caseD_1;
          goto LAB_00138eb9;
        }
        goto switchD_001368f9_caseD_0;
      }
      goto switchD_00138c51_caseD_3;
    }
    if (0x6c7f < uVar5) {
      if (0x6dff < uVar5) {
        if (uVar5 < 0x6f00) {
          if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
          if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
        }
        else {
          if (uVar5 == 0x6f00) goto LAB_00137ce2;
          if (uVar5 == 0x6f80) goto switchD_001368ad_caseD_11;
        }
        goto LAB_00138eb9;
      }
      if (uVar5 != 0x6c80) {
        if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
        if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
        goto LAB_00138eb9;
      }
      goto LAB_00138002;
    }
    if (uVar5 < 0x6a80) {
      if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
      if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
      if (uVar5 == 0x6a00) goto switchD_00138515_caseD_2;
    }
    else if (uVar5 < 0x6b80) {
      if (uVar5 == 0x6a80) goto switchD_00138515_caseD_3;
      if (uVar5 == 0x6b00) goto switchD_001368ad_caseD_8;
    }
    else {
      if (uVar5 == 0x6b80) goto switchD_001380bf_caseD_0;
      if (uVar5 == 0x6c00) goto switchD_0013807c_caseD_0;
    }
    goto LAB_00138eb9;
  case 0x23:
switchD_001367ad_caseD_e:
    snprintf(buf,buflen,"SSL - Processing of the ClientHello handshake message failed");
LAB_00136c91:
    if (uVar5 < 0x6880) {
      if (uVar5 < 0x2400) {
        if (uVar5 < 0x2200) {
          if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
          if (uVar5 == 0x2100) goto switchD_00138b8e_caseD_0;
          if (uVar5 == 0x2180) goto switchD_00138bce_caseD_0;
        }
        else if (uVar5 < 0x2300) {
          if (uVar5 == 0x2200) goto LAB_00138c75;
          if (uVar5 == 0x2280) goto switchD_00138c51_caseD_0;
        }
        else {
          if (uVar5 == 0x2300) goto switchD_00138c51_caseD_1;
          if (uVar5 == 0x2380) goto switchD_00138c51_caseD_2;
        }
        goto LAB_00138ef9;
      }
      if (0x667f < uVar5) {
        if (0x677f < uVar5) {
          if (uVar5 == 0x6780) goto switchD_0013862d_caseD_0;
          if (uVar5 == 0x6800) goto switchD_0013862d_caseD_1;
          goto LAB_00138ef9;
        }
        if (uVar5 != 0x6680) {
          if (uVar5 == 0x6700) goto switchD_001368ad_caseD_0;
          goto LAB_00138ef9;
        }
        goto switchD_001368f9_caseD_1;
      }
      if (uVar5 == 0x2400) goto switchD_00138c51_caseD_3;
      if (uVar5 != 0x2480) {
        if (uVar5 == 0x6600) goto switchD_001368f9_caseD_0;
        goto LAB_00138ef9;
      }
      goto switchD_00138eda_caseD_0;
    }
    if (0x6bff < uVar5) {
      if (0x6dff < uVar5) {
        if (uVar5 < 0x6f00) {
          if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
          if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
        }
        else {
          if (uVar5 == 0x6f00) goto LAB_00137ce2;
          if (uVar5 == 0x6f80) goto switchD_001368ad_caseD_11;
        }
        goto LAB_00138ef9;
      }
      if (0x6cff < uVar5) {
        if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
        if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
        goto LAB_00138ef9;
      }
      if (uVar5 != 0x6c00) {
        if (uVar5 == 0x6c80) goto switchD_0013807c_caseD_1;
        goto LAB_00138ef9;
      }
      goto LAB_0013832f;
    }
    if (uVar5 < 0x6a00) {
      if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
      if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
      if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
    }
    else if (uVar5 < 0x6b00) {
      if (uVar5 == 0x6a00) goto switchD_00138515_caseD_2;
      if (uVar5 == 0x6a80) goto switchD_00138515_caseD_3;
    }
    else {
      if (uVar5 == 0x6b00) goto switchD_001368ad_caseD_8;
      if (uVar5 == 0x6b80) goto switchD_001380bf_caseD_0;
    }
    goto LAB_00138ef9;
  case 0x24:
switchD_001367ad_caseD_f:
    snprintf(buf,buflen,"SSL - Processing of the ServerHello handshake message failed");
    uVar2 = uVar5 - 0x7a00 >> 7;
    if (uVar2 < 4) {
      (*(code *)(&DAT_0015ad4c + *(int *)(&DAT_0015ad4c + (ulong)uVar2 * 4)))();
      return;
    }
    goto switchD_00136416_caseD_2;
  case 0x25:
switchD_001367ad_caseD_10:
    snprintf(buf,buflen,"SSL - Processing of the Certificate handshake message failed");
    uVar2 = uVar5 - 0x7a80 >> 7;
    if (uVar2 < 4) {
      (*(code *)(&DAT_0015ad5c + *(int *)(&DAT_0015ad5c + (ulong)uVar2 * 4)))();
      return;
    }
    goto switchD_001355c3_default;
  case 0x26:
switchD_001367ad_caseD_11:
    snprintf(buf,buflen,"SSL - Processing of the CertificateRequest handshake message failed");
    goto switchD_0013587e_caseD_4;
  case 0x27:
switchD_001367ad_caseD_12:
    snprintf(buf,buflen,"SSL - Processing of the ServerKeyExchange handshake message failed");
switchD_001363d6_caseD_3:
    if (0x677f < uVar5) {
      if (uVar5 < 0x6b80) {
        if (uVar5 < 0x6980) {
          if (uVar5 < 0x6880) {
            if (uVar5 == 0x6780) goto switchD_0013862d_caseD_0;
            if (uVar5 == 0x6800) goto switchD_0013862d_caseD_1;
          }
          else {
            if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
            if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
          }
        }
        else if (uVar5 < 0x6a80) {
          if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
          if (uVar5 == 0x6a00) goto switchD_00138515_caseD_2;
        }
        else {
          if (uVar5 == 0x6a80) goto switchD_00138515_caseD_3;
          if (uVar5 == 0x6b00) goto switchD_001368ad_caseD_8;
        }
      }
      else if (uVar5 < 0x6d80) {
        if (uVar5 < 0x6c80) {
          if (uVar5 == 0x6b80) goto switchD_001380bf_caseD_0;
          if (uVar5 == 0x6c00) goto switchD_0013807c_caseD_0;
        }
        else {
          if (uVar5 == 0x6c80) goto switchD_0013807c_caseD_1;
          if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
        }
      }
      else if (uVar5 < 0x6e80) {
        if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
        if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
      }
      else {
        if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
        if (uVar5 == 0x6f00) goto LAB_00137ce2;
        if (uVar5 == 0x6f80) goto switchD_001368ad_caseD_11;
      }
      goto LAB_00138fff;
    }
    if (uVar5 < 0x2480) {
      if (uVar5 < 0x2280) {
        if (uVar5 < 0x2180) {
          if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
          if (uVar5 == 0x2100) goto switchD_00138b8e_caseD_0;
        }
        else {
          if (uVar5 == 0x2180) goto switchD_00138bce_caseD_0;
          if (uVar5 == 0x2200) goto switchD_00138c0e_caseD_0;
        }
      }
      else if (uVar5 < 0x2380) {
        if (uVar5 == 0x2280) goto switchD_00138c51_caseD_0;
        if (uVar5 == 0x2300) goto switchD_00138c51_caseD_1;
      }
      else {
        if (uVar5 == 0x2380) goto switchD_00138c51_caseD_2;
        if (uVar5 == 0x2400) goto switchD_00138c51_caseD_3;
      }
      goto LAB_00138fff;
    }
    if (uVar5 < 0x2680) {
      if (0x257f < uVar5) {
        if (uVar5 != 0x2580) {
          if (uVar5 != 0x2600) goto LAB_00138fff;
          goto switchD_00138f5a_caseD_1;
        }
        goto switchD_00138f5a_caseD_0;
      }
      if (uVar5 == 0x2480) goto switchD_00138eda_caseD_0;
      if (uVar5 != 0x2500) goto LAB_00138fff;
      goto switchD_00138f1a_caseD_0;
    }
    if (uVar5 < 0x6680) {
      if (uVar5 != 0x2680) {
        if (uVar5 == 0x6600) goto switchD_001368f9_caseD_0;
        goto LAB_00138fff;
      }
      goto switchD_00138f5a_caseD_2;
    }
    if (uVar5 == 0x6680) goto switchD_001368f9_caseD_1;
    if (uVar5 == 0x6700) goto switchD_001368ad_caseD_0;
    goto LAB_00138fff;
  case 0x28:
switchD_001367ad_caseD_13:
    snprintf(buf,buflen,"SSL - Processing of the ServerHelloDone handshake message failed");
switchD_00136416_caseD_2:
    if (0x69ff < uVar5) {
      if (0x6cff < uVar5) {
        if (0x6e7f < uVar5) {
          if (uVar5 != 0x6e80) {
            if (uVar5 != 0x6f00) {
              if (uVar5 != 0x6f80) goto LAB_00138c30;
              goto switchD_001368ad_caseD_11;
            }
            goto LAB_00137ce2;
          }
          goto switchD_001368ad_caseD_f;
        }
        if (uVar5 != 0x6d00) {
          if (uVar5 != 0x6d80) {
            if (uVar5 != 0x6e00) goto LAB_00138c30;
            goto switchD_001368ad_caseD_e;
          }
          goto switchD_0013807c_caseD_3;
        }
        goto switchD_0013807c_caseD_2;
      }
      if (0x6b7f < uVar5) {
        if (uVar5 != 0x6b80) {
          if (uVar5 != 0x6c00) {
            if (uVar5 != 0x6c80) goto LAB_00138c30;
            goto switchD_0013807c_caseD_1;
          }
          goto switchD_0013807c_caseD_0;
        }
        goto switchD_001380bf_caseD_0;
      }
      if (uVar5 != 0x6a00) {
        if (uVar5 != 0x6a80) {
          if (uVar5 != 0x6b00) goto LAB_00138c30;
          goto switchD_001368ad_caseD_8;
        }
        goto switchD_00138515_caseD_3;
      }
      goto switchD_00138515_caseD_2;
    }
    if (0x66ff < uVar5) {
      if (0x687f < uVar5) {
        if (uVar5 != 0x6880) {
          if (uVar5 != 0x6900) {
            if (uVar5 != 0x6980) goto LAB_00138c30;
            goto switchD_00138515_caseD_1;
          }
          goto switchD_0013862d_caseD_3;
        }
        goto switchD_0013862d_caseD_2;
      }
      if (uVar5 != 0x6700) {
        if (uVar5 != 0x6780) {
          if (uVar5 != 0x6800) goto LAB_00138c30;
          goto switchD_0013862d_caseD_1;
        }
        goto switchD_0013862d_caseD_0;
      }
      goto switchD_001368ad_caseD_0;
    }
    if (0x21ff < uVar5) {
      if (uVar5 != 0x2200) {
        if (uVar5 != 0x6600) {
          if (uVar5 != 0x6680) goto LAB_00138c30;
          goto switchD_001368f9_caseD_1;
        }
        goto switchD_001368f9_caseD_0;
      }
      goto switchD_00138c0e_caseD_0;
    }
    if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
    if (uVar5 == 0x2100) goto switchD_00138b8e_caseD_0;
    if (uVar5 == 0x2180) goto switchD_00138bce_caseD_0;
    goto LAB_00138c30;
  case 0x29:
switchD_001367ad_caseD_14:
    local_48 = "SSL - Processing of the ClientKeyExchange handshake message failed";
switchD_001359c0_caseD_37:
    snprintf(buf,buflen,local_48);
switchD_001355c3_default:
    if (uVar5 < 0x6980) {
      if (0x667f < uVar5) {
        if (0x67ff < uVar5) {
          if (uVar5 != 0x6800) {
            if (uVar5 != 0x6880) {
              if (uVar5 != 0x6900) goto switchD_00138b8e_default;
              goto switchD_0013862d_caseD_3;
            }
            goto switchD_0013862d_caseD_2;
          }
          goto switchD_0013862d_caseD_1;
        }
        if (uVar5 != 0x6680) {
          if (uVar5 != 0x6700) {
            if (uVar5 != 0x6780) goto switchD_00138b8e_default;
            goto switchD_0013862d_caseD_0;
          }
          goto switchD_001368ad_caseD_0;
        }
        goto switchD_001368f9_caseD_1;
      }
      if (uVar5 < 0x2200) {
        if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
        if (uVar5 == 0x2100) goto switchD_00138b8e_caseD_0;
        if (uVar5 != 0x2180) goto switchD_00138b8e_default;
        goto switchD_00138bce_caseD_0;
      }
      if (uVar5 == 0x2200) goto LAB_00138c75;
      if (uVar5 != 0x2280) {
        if (uVar5 != 0x6600) goto switchD_00138b8e_default;
        goto switchD_001368f9_caseD_0;
      }
      goto switchD_00138c51_caseD_0;
    }
    if (uVar5 < 0x6c80) {
      if (0x6aff < uVar5) {
        if (uVar5 != 0x6b00) {
          if (uVar5 != 0x6b80) {
            if (uVar5 != 0x6c00) goto switchD_00138b8e_default;
            goto switchD_0013807c_caseD_0;
          }
          goto switchD_001380bf_caseD_0;
        }
        goto switchD_001368ad_caseD_8;
      }
      if (uVar5 != 0x6980) {
        if (uVar5 != 0x6a00) {
          if (uVar5 != 0x6a80) goto switchD_00138b8e_default;
          goto switchD_00138515_caseD_3;
        }
        goto switchD_00138515_caseD_2;
      }
      goto switchD_00138515_caseD_1;
    }
    if (uVar5 < 0x6e00) {
      if (uVar5 == 0x6c80) goto LAB_00138002;
      if (uVar5 != 0x6d00) {
        if (uVar5 != 0x6d80) goto switchD_00138b8e_default;
        goto switchD_0013807c_caseD_3;
      }
      goto switchD_0013807c_caseD_2;
    }
    if (0x6eff < uVar5) {
      if (uVar5 != 0x6f00) {
        if (uVar5 != 0x6f80) goto switchD_00138b8e_default;
        goto switchD_001368ad_caseD_11;
      }
      goto LAB_00137ce2;
    }
    if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
    if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
    goto switchD_00138b8e_default;
  case 0x2a:
switchD_001367ad_caseD_15:
    local_40 = 
    "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Read Public";
    goto switchD_001359c0_caseD_46;
  case 0x2b:
switchD_001367ad_caseD_16:
    local_40 = 
    "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Calculate Secret"
    ;
    break;
  case 0x2c:
switchD_001367ad_caseD_17:
    local_40 = "SSL - Processing of the CertificateVerify handshake message failed";
    break;
  case 0x2d:
switchD_001367ad_caseD_18:
    snprintf(buf,buflen,"SSL - Processing of the ChangeCipherSpec handshake message failed");
switchD_001367ad_default:
    if (0x65ff < uVar5) goto joined_r0x00136d0d;
    if (uVar5 < 0x2500) goto LAB_00137c79;
    goto joined_r0x00137c67;
  case 0x2e:
switchD_001368ad_caseD_2f:
    local_40 = "SSL - Processing of the Finished handshake message failed";
    break;
  case 0x2f:
switchD_001368ad_caseD_30:
    snprintf(buf,buflen,"SSL - Memory allocation failed");
    if (uVar5 < 0x6700) {
      if (uVar5 < 0x2480) goto LAB_00137ea7;
      if (uVar5 < 0x2680) goto LAB_00137f1b;
      if (uVar5 < 0x2780) goto LAB_00137fc9;
      if (uVar5 != 0x2780) {
        if (uVar5 == 0x6600) goto switchD_001368f9_caseD_0;
        if (uVar5 == 0x6680) goto switchD_001368f9_caseD_1;
        goto LAB_00139089;
      }
      goto switchD_00139060_caseD_0;
    }
    if (0x6b7f < uVar5) {
      if (0x6d7f < uVar5) {
        if (0x6e7f < uVar5) {
          if (uVar5 != 0x6e80) {
            if (uVar5 == 0x6f00) goto LAB_00137ce2;
            if (uVar5 != 0x6f80) goto LAB_00139089;
            goto switchD_001368ad_caseD_11;
          }
          goto switchD_001368ad_caseD_f;
        }
        goto LAB_00138029;
      }
      if (uVar5 < 0x6c80) goto LAB_0013830d;
      goto LAB_00137feb;
    }
    if (0x68ff < uVar5) {
      if (uVar5 < 0x6a00) {
        if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
        if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
        goto LAB_00139089;
      }
      if (uVar5 == 0x6a00) goto switchD_00138515_caseD_2;
      goto LAB_00137f57;
    }
    if (uVar5 < 0x6800) {
      if (uVar5 == 0x6700) goto switchD_001368ad_caseD_0;
      if (uVar5 == 0x6780) goto switchD_0013862d_caseD_0;
    }
    else {
      if (uVar5 == 0x6800) goto switchD_0013862d_caseD_1;
      if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
    }
    goto LAB_00139089;
  case 0x30:
switchD_001368ad_caseD_31:
    snprintf(buf,buflen,"SSL - Hardware acceleration function returned with error");
    if (0x67ff < uVar5) {
      if (0x6bff < uVar5) {
        if (uVar5 < 0x6e00) {
          if (uVar5 < 0x6d00) {
            if (uVar5 == 0x6c00) goto LAB_0013832f;
            goto LAB_0013760b;
          }
          goto LAB_00137a4d;
        }
        goto LAB_001376ef;
      }
      goto LAB_0013754c;
    }
    goto LAB_00137505;
  }
LAB_00137120:
  snprintf(buf,buflen,local_40);
  if (uVar5 < 0x6600) {
LAB_00137c5b:
    if (0x24ff < uVar5) {
joined_r0x00137c67:
      if (uVar5 < 0x2780) {
        if (0x25ff < uVar5) {
LAB_001387c6:
          if (uVar5 == 0x2600) {
LAB_0013891f:
            pcVar4 = "X509 - Signature algorithm (oid) is unsupported";
            goto LAB_00138fa8;
          }
LAB_001387d1:
          if (uVar5 != 0x2680) {
LAB_001387dc:
            if (uVar5 != 0x2700) goto switchD_001390aa_default;
            goto switchD_00138f5a_caseD_3;
          }
LAB_00138913:
          pcVar4 = "X509 - Signature algorithms do not match. (see \\c ::mbedtls_x509_crt sig_oid)";
          goto LAB_00138feb;
        }
LAB_001388cb:
        if (uVar5 == 0x2500) goto switchD_00138f1a_caseD_0;
        if (uVar5 != 0x2580) goto switchD_001390aa_default;
switchD_00138f5a_caseD_0:
        snprintf(buf,buflen,"X509 - CRT/CRL/CSR has an unsupported version number");
        uVar2 = uVar5 - 0x2600 >> 7;
        if (uVar2 < 4) {
          (*(code *)(&DAT_0015af74 + *(int *)(&DAT_0015af74 + (ulong)uVar2 * 4)))();
          return;
        }
        goto LAB_00139089;
      }
      if (0x287f < uVar5) {
LAB_0013889a:
        if (uVar5 != 0x2880) {
LAB_001388a5:
          if (uVar5 == 0x2900) goto switchD_001390aa_caseD_2;
          goto joined_r0x001388b5;
        }
        goto LAB_001390e2;
      }
LAB_001388f8:
      if (uVar5 == 0x2780) goto switchD_00139060_caseD_0;
      if (uVar5 != 0x2800) goto switchD_001390aa_default;
LAB_00138cc4:
      pcVar4 = "X509 - Input invalid";
      goto LAB_0013914c;
    }
LAB_00137c79:
    if (0x227f < uVar5) {
      if (uVar5 < 0x2380) {
LAB_00138c5a:
        if (uVar5 == 0x2280) {
switchD_00138c51_caseD_0:
          snprintf(buf,buflen,"X509 - The serial tag or value is invalid");
          goto switchD_00138b8e_default;
        }
        if (uVar5 != 0x2300) goto switchD_001390aa_default;
switchD_00138c51_caseD_1:
        snprintf(buf,buflen,"X509 - The algorithm tag or value is invalid");
switchD_00138bce_default:
        switch(uVar5 - 0x2380 >> 7) {
        case 0:
switchD_00138c51_caseD_2:
          snprintf(buf,buflen,"X509 - The name tag or value is invalid");
          goto switchD_00138c0e_default;
        case 1:
          goto switchD_00138c51_caseD_3;
        case 2:
          goto switchD_00138eda_caseD_0;
        case 3:
          goto switchD_00138f1a_caseD_0;
        case 4:
          goto switchD_00138f5a_caseD_0;
        case 5:
          goto switchD_00138f5a_caseD_1;
        case 6:
          goto switchD_00138f5a_caseD_2;
        case 7:
          goto switchD_00138f5a_caseD_3;
        case 8:
          goto switchD_00139060_caseD_0;
        case 9:
          goto switchD_001390aa_caseD_0;
        case 10:
          goto switchD_001390aa_caseD_1;
        case 0xb:
          goto switchD_001390aa_caseD_2;
        case 0xc:
          goto switchD_001390aa_caseD_3;
        default:
          goto switchD_001390aa_default;
        }
      }
LAB_00138731:
      if (uVar5 == 0x2380) goto switchD_00138c51_caseD_2;
LAB_0013873c:
      if (uVar5 == 0x2400) goto switchD_00138c51_caseD_3;
      if (uVar5 != 0x2480) goto switchD_001390aa_default;
      goto switchD_00138eda_caseD_0;
    }
LAB_001381c3:
    if (uVar5 < 0x2180) {
LAB_00138a2e:
      if (uVar5 != 0x2080) {
        if (uVar5 != 0x2100) goto switchD_001390aa_default;
switchD_00138b8e_caseD_0:
        snprintf(buf,buflen,"X509 - Requested OID is unknown");
        switch(uVar5 - 0x2180 >> 7) {
        case 0:
          goto switchD_00138bce_caseD_0;
        case 1:
          goto switchD_00138c0e_caseD_0;
        case 2:
          goto switchD_00138c51_caseD_0;
        case 3:
          goto switchD_00138c51_caseD_1;
        }
        goto switchD_00138bce_default;
      }
switchD_00138b4e_caseD_0:
      snprintf(buf,buflen,"X509 - Unavailable feature, e.g. RSA hashing/encryption combination");
      switch(uVar5 - 0x2100 >> 7) {
      case 0:
        goto switchD_00138b8e_caseD_0;
      case 1:
        goto switchD_00138bce_caseD_0;
      case 2:
        goto switchD_00138c0e_caseD_0;
      case 3:
        goto switchD_00138c51_caseD_0;
      }
switchD_00138b8e_default:
      switch(uVar5 - 0x2300 >> 7) {
      case 0:
        goto switchD_00138c51_caseD_1;
      case 1:
        goto switchD_00138c51_caseD_2;
      case 2:
        goto switchD_00138c51_caseD_3;
      case 3:
        goto switchD_00138eda_caseD_0;
      case 4:
        goto switchD_00138f1a_caseD_0;
      case 5:
        goto switchD_00138f5a_caseD_0;
      case 6:
        goto switchD_00138f5a_caseD_1;
      case 7:
        goto switchD_00138f5a_caseD_2;
      case 8:
        goto switchD_00138f5a_caseD_3;
      case 9:
        goto switchD_00139060_caseD_0;
      case 10:
        goto switchD_001390aa_caseD_0;
      case 0xb:
        goto switchD_001390aa_caseD_1;
      case 0xc:
        goto switchD_001390aa_caseD_2;
      case 0xd:
        goto switchD_001390aa_caseD_3;
      default:
        goto switchD_001390aa_default;
      }
    }
    if (uVar5 != 0x2180) {
      if (uVar5 != 0x2200) goto switchD_001390aa_default;
switchD_00138c0e_caseD_0:
      pcVar4 = "X509 - The CRT/CRL/CSR version element is invalid";
LAB_00138c1c:
      snprintf(buf,buflen,pcVar4);
LAB_00138c30:
      switch(uVar5 - 0x2280 >> 7) {
      case 0:
        goto switchD_00138c51_caseD_0;
      case 1:
        goto switchD_00138c51_caseD_1;
      case 2:
        goto switchD_00138c51_caseD_2;
      case 3:
        goto switchD_00138c51_caseD_3;
      case 4:
        goto switchD_00138eda_caseD_0;
      case 5:
        goto switchD_00138f1a_caseD_0;
      case 6:
        goto switchD_00138f5a_caseD_0;
      case 7:
        goto switchD_00138f5a_caseD_1;
      case 8:
        goto switchD_00138f5a_caseD_2;
      case 9:
        goto switchD_00138f5a_caseD_3;
      case 10:
        goto switchD_00139060_caseD_0;
      case 0xb:
        goto switchD_001390aa_caseD_0;
      case 0xc:
        goto switchD_001390aa_caseD_1;
      case 0xd:
        goto switchD_001390aa_caseD_2;
      case 0xe:
        goto switchD_001390aa_caseD_3;
      default:
        goto switchD_001390aa_default;
      }
    }
switchD_00138bce_caseD_0:
    snprintf(buf,buflen,"X509 - The CRT/CRL/CSR format is invalid, e.g. different type expected");
    switch(uVar5 - 0x2200 >> 7) {
    case 0:
      goto switchD_00138c0e_caseD_0;
    case 1:
      goto switchD_00138c51_caseD_0;
    case 2:
      goto switchD_00138c51_caseD_1;
    case 3:
      goto switchD_00138c51_caseD_2;
    }
switchD_00138c0e_default:
    switch(uVar5 - 0x2400 >> 7) {
    case 0:
switchD_00138c51_caseD_3:
      snprintf(buf,buflen,"X509 - The date tag or value is invalid");
LAB_00138eb9:
      switch(uVar5 - 0x2480 >> 7) {
      case 0:
        goto switchD_00138eda_caseD_0;
      case 1:
        goto switchD_00138f1a_caseD_0;
      case 2:
        goto switchD_00138f5a_caseD_0;
      case 3:
        goto switchD_00138f5a_caseD_1;
      case 4:
        goto switchD_00138f5a_caseD_2;
      case 5:
        goto switchD_00138f5a_caseD_3;
      case 6:
        goto switchD_00139060_caseD_0;
      case 7:
        goto switchD_001390aa_caseD_0;
      case 8:
        goto switchD_001390aa_caseD_1;
      case 9:
        goto switchD_001390aa_caseD_2;
      case 10:
        goto switchD_001390aa_caseD_3;
      default:
        break;
      }
    case 1:
switchD_00138eda_caseD_0:
      snprintf(buf,buflen,"X509 - The signature tag or value invalid");
LAB_00138ef9:
      switch(uVar5 - 0x2500 >> 7) {
      case 0:
        goto switchD_00138f1a_caseD_0;
      case 1:
        goto switchD_00138f5a_caseD_0;
      case 2:
        goto switchD_00138f5a_caseD_1;
      case 3:
        goto switchD_00138f5a_caseD_2;
      case 4:
        goto switchD_00138f5a_caseD_3;
      case 5:
        goto switchD_00139060_caseD_0;
      case 6:
        goto switchD_001390aa_caseD_0;
      case 7:
        goto switchD_001390aa_caseD_1;
      case 8:
        goto switchD_001390aa_caseD_2;
      case 9:
        goto switchD_001390aa_caseD_3;
      default:
        break;
      }
    case 2:
switchD_00138f1a_caseD_0:
      snprintf(buf,buflen,"X509 - The extension tag or value is invalid");
      switch(uVar5 - 0x2580 >> 7) {
      case 0:
        goto switchD_00138f5a_caseD_0;
      case 1:
        goto switchD_00138f5a_caseD_1;
      case 2:
        goto switchD_00138f5a_caseD_2;
      case 3:
        goto switchD_00138f5a_caseD_3;
      }
      goto switchD_00138f5a_default;
    case 3:
      goto switchD_00138f5a_caseD_0;
    case 4:
      goto switchD_00138f5a_caseD_1;
    case 5:
      goto switchD_00138f5a_caseD_2;
    case 6:
switchD_00138f5a_caseD_3:
      snprintf(buf,buflen,
               "X509 - Certificate verification failed, e.g. CRL, CA or signature check failed");
switchD_00138f5a_default:
      switch(uVar5 - 0x2780 >> 7) {
      case 0:
switchD_00139060_caseD_0:
        local_58 = "X509 - Format not recognized as DER or PEM";
switchD_001359c0_caseD_1:
        snprintf(buf,buflen,local_58);
LAB_00139089:
        switch(uVar5 - 0x2800 >> 7) {
        case 0:
          goto switchD_001390aa_caseD_0;
        case 1:
          goto switchD_001390aa_caseD_1;
        case 2:
          goto switchD_001390aa_caseD_2;
        case 3:
          goto switchD_001390aa_caseD_3;
        }
        break;
      case 1:
switchD_001390aa_caseD_0:
        snprintf(buf,buflen,"X509 - Input invalid");
        if (uVar5 == 0x2980) goto switchD_001390aa_caseD_3;
        if (uVar5 == 0x2900) goto switchD_001390aa_caseD_2;
LAB_001390db:
        if (uVar5 != 0x2880) break;
LAB_001390e2:
        pcVar4 = "X509 - Allocation of memory failed";
        goto LAB_0013914c;
      case 2:
switchD_001390aa_caseD_1:
        snprintf(buf,buflen,"X509 - Allocation of memory failed");
        if (uVar5 == 0x2980) goto switchD_001390aa_caseD_3;
LAB_00139113:
        if (uVar5 == 0x2900) goto switchD_001390aa_caseD_2;
        break;
      case 3:
switchD_001390aa_caseD_2:
        snprintf(buf,buflen,"X509 - Read/write of file failed");
joined_r0x001388b5:
        if (uVar5 == 0x2980) goto switchD_001390aa_caseD_3;
        break;
      case 4:
        goto switchD_001390aa_caseD_3;
      }
      break;
    case 7:
      goto switchD_00139060_caseD_0;
    case 8:
      goto switchD_001390aa_caseD_0;
    case 9:
      goto switchD_001390aa_caseD_1;
    case 10:
      goto switchD_001390aa_caseD_2;
    case 0xb:
switchD_001390aa_caseD_3:
      pcVar4 = "X509 - Destination buffer is too small";
LAB_0013914c:
      snprintf(buf,buflen,pcVar4);
      break;
    default:
      break;
    }
  }
  else {
joined_r0x00136d0d:
    if (uVar5 < 0x6b00) {
      if (0x687f < uVar5) {
        if (0x697f < uVar5) {
          if (uVar5 != 0x6980) {
LAB_00138386:
            if (uVar5 != 0x6a00) {
              if (uVar5 != 0x6a80) goto switchD_001390aa_default;
              goto switchD_00138515_caseD_3;
            }
            goto switchD_00138515_caseD_2;
          }
          goto switchD_00138515_caseD_1;
        }
LAB_0013843f:
        if (uVar5 != 0x6880) {
          if (uVar5 != 0x6900) goto switchD_001390aa_default;
          goto switchD_0013862d_caseD_3;
        }
switchD_0013862d_caseD_2:
        snprintf(buf,buflen,"SSL - Connection requires a write call");
switchD_00138555_default:
        if (uVar5 < 0x2680) {
          if (0x237f < uVar5) {
LAB_00138726:
            if (uVar5 < 0x2500) goto LAB_00138731;
            if (uVar5 != 0x2500) goto LAB_00138a81;
            goto switchD_00138f1a_caseD_0;
          }
LAB_001386c0:
          if (0x21ff < uVar5) {
            if (uVar5 == 0x2200) goto switchD_00138c0e_caseD_0;
            goto LAB_00138c5a;
          }
LAB_00138700:
          if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
          if (uVar5 != 0x2100) {
            if (uVar5 == 0x2180) goto switchD_00138bce_caseD_0;
            goto switchD_001390aa_default;
          }
          goto switchD_00138b8e_caseD_0;
        }
        if (0x297f < uVar5) {
          if (0x66ff < uVar5) goto LAB_00138762;
LAB_001389ad:
          if (uVar5 != 0x2980) goto LAB_001389b8;
          goto switchD_001390aa_caseD_3;
        }
LAB_001386de:
        if (uVar5 < 0x2800) {
LAB_00138a5b:
          if (uVar5 == 0x2680) goto switchD_00138f5a_caseD_2;
LAB_00138a66:
          if (uVar5 == 0x2700) goto switchD_00138f5a_caseD_3;
          if (uVar5 == 0x2780) goto switchD_00139060_caseD_0;
          goto switchD_001390aa_default;
        }
LAB_0013899d:
        if (uVar5 == 0x2800) goto LAB_00138cc4;
LAB_00138c9d:
        if (uVar5 == 0x2880) goto LAB_001390e2;
        goto LAB_00139113;
      }
      if (0x66ff < uVar5) {
LAB_00138762:
        if (uVar5 != 0x6700) {
LAB_0013876d:
          if (uVar5 == 0x6780) {
switchD_0013862d_caseD_0:
            snprintf(buf,buflen,"SSL - The client initiated a reconnect from the same port");
switchD_0013862d_default:
            if (0x25ff < uVar5) {
              if (0x287f < uVar5) {
                if (uVar5 < 0x6600) goto LAB_0013889a;
                if (uVar5 != 0x6600) {
LAB_00138951:
                  if (uVar5 == 0x6680) goto switchD_001368f9_caseD_1;
                  if (uVar5 == 0x6700) goto switchD_001368ad_caseD_0;
                  goto switchD_001390aa_default;
                }
                goto switchD_001368f9_caseD_0;
              }
              if (0x26ff < uVar5) {
LAB_001388ed:
                if (uVar5 == 0x2700) goto switchD_00138f5a_caseD_3;
                goto LAB_001388f8;
              }
LAB_0013892b:
              if (uVar5 != 0x2600) {
LAB_00138936:
                if (uVar5 == 0x2680) goto switchD_00138f5a_caseD_2;
                goto switchD_001390aa_default;
              }
              goto switchD_00138f5a_caseD_1;
            }
          }
          else {
            if (uVar5 != 0x6800) goto switchD_001390aa_default;
switchD_0013862d_caseD_1:
            snprintf(buf,buflen,"SSL - The operation timed out");
switchD_0013682d_caseD_10:
            if (0x25ff < uVar5) {
              if (0x28ff < uVar5) {
                if (0x667f < uVar5) {
LAB_00138807:
                  if (uVar5 != 0x6680) goto LAB_00138812;
                  goto switchD_001368f9_caseD_1;
                }
                goto LAB_00138aef;
              }
              if (uVar5 < 0x2780) goto LAB_001387c6;
              if (uVar5 == 0x2780) goto switchD_00139060_caseD_0;
LAB_00138c89:
              if (uVar5 == 0x2800) {
LAB_00138cad:
                pcVar4 = "X509 - Input invalid";
                goto LAB_0013914c;
              }
              goto LAB_001390db;
            }
          }
          if (uVar5 < 0x2300) {
LAB_00138a01:
            if (uVar5 < 0x2180) goto LAB_00138a2e;
            if (uVar5 == 0x2180) goto switchD_00138bce_caseD_0;
            if (uVar5 == 0x2200) goto switchD_00138c0e_caseD_0;
            goto LAB_00138a1e;
          }
          if (0x247f < uVar5) {
            if (uVar5 == 0x2480) goto switchD_00138eda_caseD_0;
            goto LAB_001388cb;
          }
          if (uVar5 == 0x2300) goto switchD_00138c51_caseD_1;
LAB_0013886d:
          if (uVar5 == 0x2380) goto switchD_00138c51_caseD_2;
          if (uVar5 != 0x2400) goto switchD_001390aa_default;
          goto switchD_00138c51_caseD_3;
        }
switchD_001368ad_caseD_0:
        snprintf(buf,buflen,"SSL - Record header looks valid but is not expected");
switchD_001368ad_caseD_12:
        if (uVar5 < 0x2580) {
LAB_001389f6:
          if (0x22ff < uVar5) {
            if (uVar5 < 0x2400) {
LAB_00138ac9:
              if (uVar5 == 0x2300) goto switchD_00138c51_caseD_1;
              if (uVar5 == 0x2380) goto switchD_00138c51_caseD_2;
            }
            else {
              if (uVar5 == 0x2400) goto switchD_00138c51_caseD_3;
LAB_00138aae:
              if (uVar5 == 0x2480) goto switchD_00138eda_caseD_0;
              if (uVar5 == 0x2500) goto switchD_00138f1a_caseD_0;
            }
            goto switchD_001390aa_default;
          }
          goto LAB_00138a01;
        }
        if (0x27ff < uVar5) {
          if (uVar5 < 0x2980) goto LAB_0013899d;
          goto LAB_001389ad;
        }
LAB_00138a54:
        if (0x267f < uVar5) goto LAB_00138a5b;
LAB_00138a81:
        if (uVar5 == 0x2580) goto switchD_00138f5a_caseD_0;
        if (uVar5 != 0x2600) goto switchD_001390aa_default;
switchD_00138f5a_caseD_1:
        pcVar4 = "X509 - Signature algorithm (oid) is unsupported";
LAB_00138fa8:
        snprintf(buf,buflen,pcVar4);
LAB_00138fbc:
        switch(uVar5 - 0x2680 >> 7) {
        case 0:
          goto switchD_00138f5a_caseD_2;
        case 1:
          goto switchD_00138f5a_caseD_3;
        case 2:
          goto switchD_00139060_caseD_0;
        case 3:
          goto switchD_001390aa_caseD_0;
        case 4:
          goto switchD_001390aa_caseD_1;
        case 5:
          goto switchD_001390aa_caseD_2;
        case 6:
          goto switchD_001390aa_caseD_3;
        }
        goto switchD_001390aa_default;
      }
LAB_001389b8:
      if (uVar5 == 0x6600) {
switchD_001368f9_caseD_0:
        snprintf(buf,buflen,"SSL - Couldn\'t set the hash for verifying CertificateVerify");
switchD_001368f9_caseD_14:
        switch(uVar5 - 0x2080 >> 7) {
        case 0:
          goto switchD_00138b4e_caseD_0;
        case 1:
          goto switchD_00138b8e_caseD_0;
        case 2:
          goto switchD_00138bce_caseD_0;
        case 3:
          goto switchD_00138c0e_caseD_0;
        case 4:
          goto switchD_00138c51_caseD_0;
        case 5:
          goto switchD_00138c51_caseD_1;
        case 6:
          goto switchD_00138c51_caseD_2;
        case 7:
          goto switchD_00138c51_caseD_3;
        case 8:
          goto switchD_00138eda_caseD_0;
        case 9:
          goto switchD_00138f1a_caseD_0;
        case 10:
          goto switchD_00138f5a_caseD_0;
        case 0xb:
          goto switchD_00138f5a_caseD_1;
        case 0xc:
          goto switchD_00138f5a_caseD_2;
        case 0xd:
          goto switchD_00138f5a_caseD_3;
        case 0xe:
          goto switchD_00139060_caseD_0;
        case 0xf:
          goto switchD_001390aa_caseD_0;
        case 0x10:
          goto switchD_001390aa_caseD_1;
        case 0x11:
          goto switchD_001390aa_caseD_2;
        case 0x12:
          goto switchD_001390aa_caseD_3;
        default:
          goto switchD_001390aa_default;
        }
      }
      if (uVar5 != 0x6680) goto switchD_001390aa_default;
switchD_001368f9_caseD_1:
      snprintf(buf,buflen,"SSL - The alert message received indicates a non-fatal error");
switchD_00136279_caseD_13:
      if (uVar5 < 0x2580) goto LAB_001389f6;
      if (uVar5 < 0x2800) goto LAB_00138a54;
      if (0x28ff < uVar5) {
LAB_00138aef:
        if (uVar5 == 0x2900) goto switchD_001390aa_caseD_2;
        goto LAB_00138afa;
      }
      if (uVar5 == 0x2800) goto LAB_00138cc4;
      goto LAB_001390db;
    }
    if (0x6d7f < uVar5) {
      if (uVar5 < 0x6e80) {
        if (uVar5 == 0x6d80) {
switchD_0013807c_caseD_3:
          snprintf(buf,buflen,"SSL - Session ticket has expired");
          switch(uVar5 - 0x6b80 >> 7) {
          case 0:
            goto switchD_001380bf_caseD_0;
          case 1:
switchD_0013807c_caseD_0:
            goto LAB_0013832f;
          case 2:
switchD_0013807c_caseD_1:
            pcVar4 = "SSL - Unknown identity received (eg, PSK identity)";
            goto LAB_0013813b;
          case 3:
            goto switchD_0013807c_caseD_2;
          default:
            goto switchD_001380bf_default;
          }
        }
        if (uVar5 != 0x6e00) goto switchD_001390aa_default;
switchD_001368ad_caseD_e:
        snprintf(buf,buflen,"SSL - Processing of the NewSessionTicket handshake message failed");
        switch(uVar5 - 0x6c00 >> 7) {
        case 0:
          goto switchD_0013807c_caseD_0;
        case 1:
          goto switchD_0013807c_caseD_1;
        case 2:
          goto switchD_0013807c_caseD_2;
        case 3:
          goto switchD_0013807c_caseD_3;
        }
switchD_0013807c_default:
        if (0x27ff < uVar5) {
          if (0x67ff < uVar5) {
            if (0x69ff < uVar5) {
              if (uVar5 < 0x6b00) goto LAB_00138386;
              goto LAB_001383a1;
            }
LAB_001385d2:
            if (0x68ff < uVar5) {
LAB_001385dd:
              if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
              if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
              goto switchD_001390aa_default;
            }
            goto LAB_0013867b;
          }
          if (0x65ff < uVar5) {
LAB_00138490:
            if (uVar5 < 0x6700) goto LAB_001389b8;
            goto LAB_00138812;
          }
          if (uVar5 < 0x2900) goto LAB_00138c89;
          goto LAB_001388a5;
        }
LAB_001383e2:
        if (0x23ff < uVar5) {
          if (uVar5 < 0x2600) {
            if (0x24ff < uVar5) goto LAB_001388cb;
            goto LAB_0013873c;
          }
          if (uVar5 < 0x2700) {
LAB_00138465:
            if (uVar5 == 0x2600) goto LAB_0013891f;
            goto LAB_00138936;
          }
          goto LAB_00138a66;
        }
        if (uVar5 < 0x2200) goto LAB_00138700;
        if (0x22ff < uVar5) goto LAB_00138ac9;
        if (uVar5 == 0x2200) goto LAB_00138c75;
LAB_00138a1e:
        if (uVar5 == 0x2280) goto switchD_00138c51_caseD_0;
        goto switchD_001390aa_default;
      }
      if (uVar5 != 0x6e80) {
        if (uVar5 != 0x6f00) {
          if (uVar5 != 0x6f80) goto switchD_001390aa_default;
switchD_001368ad_caseD_11:
          snprintf(buf,buflen,"SSL - Hardware acceleration function skipped / left alone data");
switchD_00135e39_default:
          if (uVar5 < 0x6600) goto LAB_00137c5b;
          if (0x6a7f < uVar5) {
            if (0x6cff < uVar5) {
              if (uVar5 < 0x6e00) {
                if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
                if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
              }
              else {
                if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
                if (uVar5 == 0x6e80) goto switchD_001368ad_caseD_f;
                if (uVar5 == 0x6f00) goto LAB_00137ce2;
              }
              goto switchD_001390aa_default;
            }
            goto LAB_00138103;
          }
          if (uVar5 < 0x6800) goto LAB_00138490;
          if (0x68ff < uVar5) {
            if (uVar5 == 0x6900) goto switchD_0013862d_caseD_3;
            goto LAB_001384a7;
          }
          goto LAB_0013867b;
        }
LAB_00137ce2:
        pcVar4 = "SSL - Processing of the compression / decompression failed";
        goto LAB_0013914c;
      }
switchD_001368ad_caseD_f:
      local_50 = "SSL - Handshake protocol not within min/max boundaries";
switchD_001359c0_caseD_45:
      snprintf(buf,buflen,local_50);
      if (uVar5 < 0x6680) {
        if (uVar5 < 0x2480) {
LAB_00137ea7:
          if (uVar5 < 0x2280) {
            if (0x217f < uVar5) {
              if (uVar5 != 0x2180) {
                if (uVar5 != 0x2200) goto LAB_00139089;
                goto switchD_00138c0e_caseD_0;
              }
              goto switchD_00138bce_caseD_0;
            }
            if (uVar5 == 0x2080) goto switchD_00138b4e_caseD_0;
            if (uVar5 != 0x2100) goto LAB_00139089;
            goto switchD_00138b8e_caseD_0;
          }
          if (uVar5 < 0x2380) {
            if (uVar5 == 0x2280) goto switchD_00138c51_caseD_0;
            if (uVar5 != 0x2300) goto LAB_00139089;
            goto switchD_00138c51_caseD_1;
          }
          if (uVar5 == 0x2380) goto switchD_00138c51_caseD_2;
          if (uVar5 != 0x2400) goto LAB_00139089;
          goto switchD_00138c51_caseD_3;
        }
        if (0x267f < uVar5) {
          if (uVar5 < 0x2780) {
LAB_00137fc9:
            if (uVar5 == 0x2680) goto LAB_00138913;
            if (uVar5 != 0x2700) goto LAB_00139089;
            goto switchD_00138f5a_caseD_3;
          }
          if (uVar5 != 0x2780) {
            if (uVar5 != 0x6600) goto LAB_00139089;
            goto switchD_001368f9_caseD_0;
          }
          goto switchD_00139060_caseD_0;
        }
LAB_00137f1b:
        if (uVar5 < 0x2580) {
          if (uVar5 == 0x2480) goto switchD_00138eda_caseD_0;
          if (uVar5 != 0x2500) goto LAB_00139089;
          goto switchD_00138f1a_caseD_0;
        }
        if (uVar5 != 0x2580) {
          if (uVar5 != 0x2600) goto LAB_00139089;
          goto switchD_00138f5a_caseD_1;
        }
        goto switchD_00138f5a_caseD_0;
      }
      if (uVar5 < 0x6a80) {
        if (0x687f < uVar5) {
          if (0x697f < uVar5) {
            if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
            if (uVar5 != 0x6a00) goto LAB_00139089;
            goto switchD_00138515_caseD_2;
          }
          if (uVar5 != 0x6880) {
            if (uVar5 != 0x6900) goto LAB_00139089;
            goto switchD_0013862d_caseD_3;
          }
          goto switchD_0013862d_caseD_2;
        }
        if (0x677f < uVar5) {
          if (uVar5 != 0x6780) {
            if (uVar5 != 0x6800) goto LAB_00139089;
            goto switchD_0013862d_caseD_1;
          }
          goto switchD_0013862d_caseD_0;
        }
        if (uVar5 != 0x6680) {
          if (uVar5 != 0x6700) goto LAB_00139089;
          goto switchD_001368ad_caseD_0;
        }
        goto switchD_001368f9_caseD_1;
      }
      if (uVar5 < 0x6c80) {
        if (0x6b7f < uVar5) {
LAB_0013830d:
          if (uVar5 != 0x6b80) {
            if (uVar5 == 0x6c00) goto switchD_0013807c_caseD_0;
            goto LAB_00139089;
          }
          goto switchD_001380bf_caseD_0;
        }
LAB_00137f57:
        if (uVar5 == 0x6a80) goto switchD_00138515_caseD_3;
        if (uVar5 != 0x6b00) goto LAB_00139089;
        goto switchD_001368ad_caseD_8;
      }
      if (uVar5 < 0x6d80) {
LAB_00137feb:
        if (uVar5 == 0x6c80) goto LAB_00138002;
        if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
      }
      else {
LAB_00138029:
        if (uVar5 == 0x6d80) goto switchD_0013807c_caseD_3;
        if (uVar5 == 0x6e00) goto switchD_001368ad_caseD_e;
      }
      goto LAB_00139089;
    }
    if (uVar5 < 0x6c00) {
LAB_001383a1:
      if (uVar5 == 0x6b00) {
switchD_001368ad_caseD_8:
        snprintf(buf,buflen,"SSL - Unexpected message at ServerHello in renegotiation");
        switch(uVar5 - 0x6900 >> 7) {
        case 0:
switchD_0013862d_caseD_3:
          snprintf(buf,buflen,"SSL - Connection requires a read call");
          break;
        case 1:
switchD_00138515_caseD_1:
          snprintf(buf,buflen,
                   "SSL - None of the common ciphersuites is usable (eg, no suitable certificate, see debug messages)"
                  );
          switch(uVar5 - 0x6780 >> 7) {
          case 0:
            goto switchD_0013862d_caseD_0;
          case 1:
            goto switchD_0013862d_caseD_1;
          case 2:
            goto switchD_0013862d_caseD_2;
          case 3:
            goto switchD_0013862d_caseD_3;
          }
          goto switchD_0013862d_default;
        case 2:
switchD_00138515_caseD_2:
          snprintf(buf,buflen,"SSL - A buffer is too small to receive or write a message");
switchD_0013666a_caseD_c:
          if (0x26ff < uVar5) {
            if (0x667f < uVar5) {
              if (0x67ff < uVar5) goto LAB_001385d2;
              goto LAB_00138807;
            }
            if (0x287f < uVar5) goto LAB_00138591;
            goto LAB_001388ed;
          }
          if (uVar5 < 0x2380) goto LAB_001386c0;
          if (uVar5 < 0x2500) goto LAB_00138731;
          if (uVar5 < 0x2600) goto LAB_001388cb;
          goto LAB_0013892b;
        case 3:
switchD_00138515_caseD_3:
          snprintf(buf,buflen,"SSL - DTLS client must retry for hello verification");
          switch(uVar5 - 0x6880 >> 7) {
          case 0:
            goto switchD_0013862d_caseD_2;
          case 1:
            goto switchD_0013862d_caseD_3;
          case 2:
            goto switchD_00138515_caseD_1;
          case 3:
            goto switchD_00138515_caseD_2;
          }
          goto switchD_00138555_default;
        }
        if (uVar5 < 0x2680) {
          if (0x237f < uVar5) goto LAB_00138726;
          if (uVar5 < 0x2200) goto LAB_00138700;
          if (uVar5 != 0x2200) goto LAB_00138c5a;
LAB_00138c75:
          pcVar4 = "X509 - The CRT/CRL/CSR version element is invalid";
          goto LAB_00138c1c;
        }
        if (uVar5 < 0x2980) goto LAB_001386de;
        if (uVar5 < 0x6700) goto LAB_001389ad;
        if (0x67ff < uVar5) {
LAB_0013867b:
          if (uVar5 != 0x6800) {
            if (uVar5 == 0x6880) goto switchD_0013862d_caseD_2;
            goto switchD_001390aa_default;
          }
          goto switchD_0013862d_caseD_1;
        }
LAB_00138812:
        if (uVar5 == 0x6700) goto switchD_001368ad_caseD_0;
        if (uVar5 == 0x6780) goto switchD_0013862d_caseD_0;
      }
      else if (uVar5 == 0x6b80) {
switchD_001380bf_caseD_0:
        snprintf(buf,buflen,"SSL - A counter would wrap (eg, too many messages exchanged)");
switchD_001380bf_default:
        if (uVar5 < 0x2800) goto LAB_001383e2;
        if (0x677f < uVar5) {
          if (uVar5 < 0x6980) {
            if (uVar5 < 0x6880) goto LAB_0013876d;
            goto LAB_0013843f;
          }
          if (0x6a7f < uVar5) goto LAB_001384c2;
LAB_001384a7:
          if (uVar5 == 0x6980) goto switchD_00138515_caseD_1;
          if (uVar5 == 0x6a00) goto switchD_00138515_caseD_2;
          goto switchD_001390aa_default;
        }
        if (0x297f < uVar5) {
LAB_00138480:
          if (0x667f < uVar5) goto LAB_00138951;
          goto LAB_00138afa;
        }
LAB_00138c96:
        if (uVar5 != 0x2800) goto LAB_00138c9d;
        goto LAB_00138cad;
      }
    }
    else {
      if (uVar5 == 0x6c00) {
LAB_0013832f:
        snprintf(buf,buflen,"SSL - Internal error (eg, unexpected failure in lower-level module)");
        goto switchD_0013807c_default;
      }
LAB_00137176:
      if (uVar5 != 0x6c80) {
        if (uVar5 == 0x6d00) goto switchD_0013807c_caseD_2;
        goto switchD_001390aa_default;
      }
LAB_00138002:
      pcVar4 = "SSL - Unknown identity received (eg, PSK identity)";
LAB_0013813b:
      snprintf(buf,buflen,pcVar4);
      if (uVar5 < 0x2880) {
        if (0x247f < uVar5) {
          if (0x267f < uVar5) {
            if (0x277f < uVar5) goto LAB_001388f8;
            goto LAB_001387d1;
          }
LAB_0013822a:
          if (0x257f < uVar5) goto LAB_00138a81;
          goto LAB_00138aae;
        }
LAB_001381bc:
        if (uVar5 < 0x2280) goto LAB_001381c3;
        if (uVar5 < 0x2380) goto LAB_00138c5a;
        goto LAB_0013886d;
      }
      if (0x687f < uVar5) {
        if (uVar5 < 0x6a80) {
LAB_001381a5:
          if (uVar5 < 0x6980) goto LAB_0013843f;
          goto LAB_001384a7;
        }
        if (0x6b7f < uVar5) {
LAB_00138204:
          if (uVar5 != 0x6b80) {
            if (uVar5 != 0x6c00) goto switchD_001390aa_default;
            goto switchD_0013807c_caseD_0;
          }
          goto switchD_001380bf_caseD_0;
        }
LAB_001384c2:
        if (uVar5 == 0x6a80) goto switchD_00138515_caseD_3;
        if (uVar5 != 0x6b00) goto switchD_001390aa_default;
        goto switchD_001368ad_caseD_8;
      }
LAB_00138183:
      if (0x667f < uVar5) {
        if (0x677f < uVar5) goto LAB_0013876d;
        goto LAB_00138951;
      }
LAB_00138591:
      if (uVar5 < 0x2980) goto LAB_00138c9d;
LAB_00138afa:
      if (uVar5 == 0x2980) goto switchD_001390aa_caseD_3;
      if (uVar5 == 0x6600) goto switchD_001368f9_caseD_0;
    }
  }
switchD_001390aa_default:
  if (*buf == '\0') {
    snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar5);
  }
LAB_00139184:
  uVar5 = uVar1 & 0x7fff007f;
  if ((uVar1 & 0x7fff007f) == 0) {
    return;
  }
  sVar3 = strlen(buf);
  local_68 = buflen;
  if (sVar3 != 0) {
    if (buflen - sVar3 < 5) {
      return;
    }
    snprintf(buf + sVar3,buflen - sVar3," : ");
    buf = buf + sVar3 + 3;
    local_68 = buflen - (sVar3 + 3);
  }
  uVar1 = uVar5 - 2;
  switch(uVar1) {
  case 0:
switchD_001391f1_caseD_0:
    pcVar4 = "BIGNUM - An error occurred while reading from or writing to a file";
    break;
  case 1:
    pcVar4 = "HMAC_DRBG - Too many random requested in single call";
    break;
  case 2:
switchD_001391f1_caseD_2:
    snprintf(buf,local_68,"BIGNUM - Bad input parameters to function");
    switch(uVar5 - 6 >> 1 | (uint)((uVar5 - 6 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001391f1_caseD_4;
    case 1:
      goto switchD_001391f1_caseD_6;
    case 2:
      goto switchD_001391f1_caseD_8;
    case 3:
      goto switchD_001393d3_caseD_0;
    case 4:
      goto switchD_001393d3_caseD_1;
    case 5:
      goto switchD_001393d3_caseD_2;
    default:
      goto code_r0x00139643;
    case 8:
      goto switchD_001393d3_caseD_5;
    case 9:
      goto switchD_001393d3_caseD_6;
    case 0xf:
      goto switchD_001391f1_caseD_22;
    }
  case 3:
    goto switchD_001391f1_caseD_3;
  case 4:
switchD_001391f1_caseD_4:
    snprintf(buf,local_68,"BIGNUM - There is an invalid character in the digit string");
    switch(uVar5 - 8 >> 1 | (uint)((uVar5 - 8 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001391f1_caseD_6;
    case 1:
      goto switchD_001391f1_caseD_8;
    case 2:
      goto switchD_001393d3_caseD_0;
    case 3:
      goto switchD_001393d3_caseD_1;
    case 4:
      goto switchD_001393d3_caseD_2;
    case 7:
      goto switchD_001393d3_caseD_5;
    case 8:
      goto switchD_001393d3_caseD_6;
    case 0xe:
      goto switchD_001391f1_caseD_22;
    }
    goto code_r0x00139643;
  case 5:
    goto switchD_001391f1_caseD_5;
  case 6:
switchD_001391f1_caseD_6:
    snprintf(buf,local_68,"BIGNUM - The buffer is too small to write to");
    switch(uVar5 - 10 >> 1 | (uint)((uVar5 - 10 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001391f1_caseD_8;
    case 1:
      goto switchD_001393d3_caseD_0;
    case 2:
      goto switchD_001393d3_caseD_1;
    case 3:
      goto switchD_001393d3_caseD_2;
    default:
      goto code_r0x00139686;
    case 6:
      goto switchD_001393d3_caseD_5;
    case 7:
      goto switchD_001393d3_caseD_6;
    case 0xd:
      goto switchD_001391f1_caseD_22;
    case 0xe:
      goto switchD_001391f1_caseD_24;
    }
  case 7:
    goto switchD_001391f1_caseD_7;
  case 8:
switchD_001391f1_caseD_8:
    snprintf(buf,local_68,"BIGNUM - The input arguments are negative or result in illegal output");
    switch(uVar5 - 0xc >> 1 | (uint)((uVar5 - 0xc & 1) != 0) << 0x1f) {
    case 0:
switchD_001393d3_caseD_0:
      snprintf(buf,local_68,"BIGNUM - The input argument for division is zero, which is not allowed"
              );
      switch(uVar5) {
      case 5:
        goto switchD_001391f1_caseD_3;
      default:
        goto switchD_001395b7_caseD_47;
      case 7:
        goto switchD_001391f1_caseD_5;
      case 9:
        goto switchD_001391f1_caseD_7;
      case 0xb:
        goto switchD_00139694_caseD_b;
      case 0xd:
        goto switchD_001391f1_caseD_b;
      case 0xe:
        goto switchD_001391f1_caseD_c;
      case 0xf:
        goto switchD_001391f1_caseD_d;
      case 0x10:
        goto switchD_001391f1_caseD_e;
      case 0x12:
        goto switchD_001391f1_caseD_10;
      case 0x14:
        goto switchD_001391f1_caseD_12;
      case 0x16:
        goto switchD_001391f1_caseD_14;
      case 0x18:
        goto switchD_001391f1_caseD_16;
      case 0x24:
        goto switchD_001391f1_caseD_22;
      case 0x26:
        goto switchD_001391f1_caseD_24;
      case 0x28:
        goto switchD_00139406_caseD_28;
      }
    case 1:
switchD_001393d3_caseD_1:
      snprintf(buf,local_68,"BIGNUM - The input arguments are not acceptable");
      if (uVar5 < 0x24) {
        switch(uVar5) {
        case 5:
          goto switchD_001391f1_caseD_3;
        default:
          goto switchD_001395b7_caseD_47;
        case 7:
          goto switchD_001391f1_caseD_5;
        case 9:
          goto switchD_001391f1_caseD_7;
        case 0xb:
          goto switchD_00139694_caseD_b;
        case 0xd:
          goto switchD_001391f1_caseD_b;
        case 0xf:
          goto switchD_001391f1_caseD_d;
        case 0x10:
          goto switchD_001391f1_caseD_e;
        case 0x12:
          goto switchD_001391f1_caseD_10;
        case 0x14:
          goto switchD_001391f1_caseD_12;
        case 0x16:
          goto switchD_001391f1_caseD_14;
        case 0x18:
          goto switchD_001391f1_caseD_16;
        }
      }
      goto LAB_00139612;
    case 2:
switchD_001393d3_caseD_2:
      snprintf(buf,local_68,"BIGNUM - Memory allocation failed");
      if (uVar5 < 0x24) {
        switch(uVar5) {
        case 5:
          goto switchD_001391f1_caseD_3;
        default:
          goto switchD_001395b7_caseD_47;
        case 7:
          goto switchD_001391f1_caseD_5;
        case 9:
          goto switchD_001391f1_caseD_7;
        case 0xb:
          goto switchD_00139694_caseD_b;
        case 0xd:
          goto switchD_001391f1_caseD_b;
        case 0xf:
          goto switchD_001391f1_caseD_d;
        case 0x12:
          goto switchD_001391f1_caseD_10;
        case 0x14:
          goto switchD_001391f1_caseD_12;
        case 0x16:
          goto switchD_001391f1_caseD_14;
        case 0x18:
          goto switchD_001391f1_caseD_16;
        }
      }
LAB_00139612:
      if (uVar5 == 0x24) goto switchD_001391f1_caseD_22;
      if (uVar5 == 0x26) goto switchD_001391f1_caseD_24;
      break;
    default:
      goto code_r0x00139686;
    case 5:
switchD_001393d3_caseD_5:
      snprintf(buf,local_68,"BLOWFISH - Invalid key length");
      if (uVar5 < 0x24) {
        switch(uVar5) {
        case 5:
          goto switchD_001391f1_caseD_3;
        default:
          goto switchD_001395b7_caseD_47;
        case 7:
          goto switchD_001391f1_caseD_5;
        case 9:
          goto switchD_001391f1_caseD_7;
        case 0xb:
          goto switchD_00139694_caseD_b;
        case 0xd:
          goto switchD_001391f1_caseD_b;
        case 0xf:
          goto switchD_001391f1_caseD_d;
        case 0x12:
          goto switchD_001391f1_caseD_10;
        case 0x14:
          goto switchD_001391f1_caseD_12;
        case 0x18:
          goto switchD_001391f1_caseD_16;
        }
      }
      goto LAB_00139612;
    case 6:
switchD_001393d3_caseD_6:
      snprintf(buf,local_68,"BLOWFISH - Invalid data input length");
      if (uVar5 < 0x2e) {
        if (uVar5 < 0x24) {
          switch(uVar5) {
          case 5:
            goto switchD_001391f1_caseD_3;
          default:
            goto switchD_001395b7_caseD_47;
          case 7:
            goto switchD_001391f1_caseD_5;
          case 9:
            goto switchD_001391f1_caseD_7;
          case 0xb:
            goto switchD_00139694_caseD_b;
          case 0xd:
            goto switchD_001391f1_caseD_b;
          case 0xf:
            goto switchD_001391f1_caseD_d;
          case 0x12:
            goto switchD_001391f1_caseD_10;
          case 0x14:
            goto switchD_001391f1_caseD_12;
          }
        }
        goto LAB_00139612;
      }
      switch(uVar5) {
      case 0x43:
        goto switchD_001395b7_caseD_43;
      case 0x44:
        goto switchD_001395b7_caseD_44;
      case 0x45:
        goto switchD_001395b7_caseD_45;
      case 0x46:
        goto switchD_001395b7_caseD_46;
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_001395b7_caseD_47;
      case 0x48:
        goto switchD_001395b7_caseD_48;
      case 0x4a:
        goto switchD_001395b7_caseD_4a;
      case 0x4c:
        goto switchD_001395b7_caseD_4c;
      case 0x4e:
        goto switchD_001395b7_caseD_4e;
      case 0x50:
        goto switchD_001395b7_caseD_50;
      case 0x52:
        goto switchD_001395b7_caseD_52;
      default:
        if (uVar5 == 0x2e) goto LAB_001395e3;
        goto switchD_001395b7_default;
      }
    case 0xc:
      goto switchD_001391f1_caseD_22;
    case 0xd:
      goto switchD_001391f1_caseD_24;
    }
    goto switchD_00139694_default;
  case 9:
  case 0xf:
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x31:
  case 0x33:
  case 0x35:
  case 0x37:
  case 0x39:
  case 0x3f:
    goto switchD_001391f1_caseD_9;
  case 10:
switchD_001391f1_caseD_a:
    pcVar4 = "BIGNUM - The input argument for division is zero, which is not allowed";
    break;
  case 0xb:
    goto switchD_001391f1_caseD_b;
  case 0xc:
switchD_001391f1_caseD_c:
    pcVar4 = "BIGNUM - The input arguments are not acceptable";
    break;
  case 0xd:
    goto switchD_001391f1_caseD_d;
  case 0xe:
switchD_001391f1_caseD_e:
    pcVar4 = "BIGNUM - Memory allocation failed";
    break;
  case 0x10:
    goto switchD_001391f1_caseD_10;
  case 0x12:
    goto switchD_001391f1_caseD_12;
  case 0x14:
switchD_001391f1_caseD_14:
    pcVar4 = "BLOWFISH - Invalid key length";
    break;
  case 0x16:
switchD_001391f1_caseD_16:
    snprintf(buf,local_68,"BLOWFISH - Invalid data input length");
switchD_001391f1_caseD_9:
    if (uVar5 < 0x30) {
      if (uVar5 == 0xb) {
switchD_00139694_caseD_b:
        pcVar4 = "OID - output buffer is too small";
      }
      else if (uVar5 == 0x28) {
switchD_00139406_caseD_28:
        pcVar4 = "XTEA - The data input has an invalid length";
      }
      else {
        if (uVar5 != 0x2e) goto switchD_001395b7_caseD_47;
LAB_001395e3:
        pcVar4 = "OID - OID is not found";
      }
    }
    else {
      switch(uVar5) {
      case 0x43:
switchD_001395b7_caseD_43:
        pcVar4 = "NET - Buffer is too small to hold the data";
        break;
      case 0x44:
switchD_001395b7_caseD_44:
        pcVar4 = "NET - The connection to the given server / port failed";
        break;
      case 0x45:
switchD_001395b7_caseD_45:
        pcVar4 = "NET - The context is invalid, eg because it was free()ed";
        break;
      case 0x46:
switchD_001395b7_caseD_46:
        pcVar4 = "NET - Binding of the socket failed";
        break;
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_001395b7_caseD_47;
      case 0x48:
switchD_001395b7_caseD_48:
        pcVar4 = "NET - Could not listen on the socket";
        break;
      case 0x4a:
switchD_001395b7_caseD_4a:
        pcVar4 = "NET - Could not accept the incoming connection";
        break;
      case 0x4c:
switchD_001395b7_caseD_4c:
        pcVar4 = "NET - Reading information from the socket failed";
        break;
      case 0x4e:
switchD_001395b7_caseD_4e:
        pcVar4 = "NET - Sending information through the socket failed";
        break;
      case 0x50:
switchD_001395b7_caseD_50:
        pcVar4 = "NET - Connection was reset by peer";
        break;
      case 0x52:
switchD_001395b7_caseD_52:
        pcVar4 = "NET - Failed to get an IP address for the given hostname";
        break;
      default:
switchD_001395b7_default:
        if (uVar5 != 0x30) goto switchD_001395b7_caseD_47;
        pcVar4 = "PADLOCK - Input data should be aligned";
      }
    }
    break;
  case 0x1e:
    pcVar4 = "AES - Invalid key length";
    break;
  case 0x20:
    pcVar4 = "AES - Invalid data input length";
    break;
  case 0x22:
switchD_001391f1_caseD_22:
    snprintf(buf,local_68,"CAMELLIA - Invalid key length");
code_r0x00139643:
    switch(uVar5) {
    case 5:
      goto switchD_001391f1_caseD_3;
    case 6:
    case 8:
    case 10:
    case 0xc:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x13:
      goto switchD_001395b7_caseD_47;
    case 7:
      goto switchD_001391f1_caseD_5;
    case 9:
      goto switchD_001391f1_caseD_7;
    case 0xb:
      goto switchD_00139694_caseD_b;
    case 0xd:
      goto switchD_001391f1_caseD_b;
    case 0xf:
      goto switchD_001391f1_caseD_d;
    case 0x12:
      goto switchD_001391f1_caseD_10;
    case 0x14:
      goto switchD_001391f1_caseD_12;
    default:
      if (uVar5 != 0x28) {
        if (uVar5 != 0x26) goto switchD_001395b7_caseD_47;
        goto switchD_001391f1_caseD_24;
      }
      goto switchD_00139406_caseD_28;
    }
  case 0x24:
switchD_001391f1_caseD_24:
    snprintf(buf,local_68,"CAMELLIA - Invalid data input length");
code_r0x00139686:
    switch(uVar5) {
    case 5:
switchD_001391f1_caseD_3:
      pcVar4 = "HMAC_DRBG - Input too large (Entropy + additional)";
      break;
    case 6:
    case 8:
    case 10:
    case 0xc:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x13:
      goto switchD_001395b7_caseD_47;
    case 7:
switchD_001391f1_caseD_5:
      pcVar4 = "HMAC_DRBG - Read/write error in file";
      break;
    case 9:
switchD_001391f1_caseD_7:
      pcVar4 = "HMAC_DRBG - The entropy source failed";
      break;
    case 0xb:
      goto switchD_00139694_caseD_b;
    case 0xd:
switchD_001391f1_caseD_b:
      pcVar4 = "CCM - Bad input parameters to function";
      break;
    case 0xf:
switchD_001391f1_caseD_d:
      pcVar4 = "CCM - Authenticated decryption failed";
      break;
    case 0x12:
switchD_001391f1_caseD_10:
      pcVar4 = "GCM - Authenticated decryption failed";
      break;
    case 0x14:
switchD_001391f1_caseD_12:
      pcVar4 = "GCM - Bad input parameters to function";
      break;
    default:
switchD_00139694_default:
      if (uVar5 != 0x28) goto switchD_001395b7_caseD_47;
      goto switchD_00139406_caseD_28;
    }
    break;
  case 0x28:
    snprintf(buf,local_68,"BASE64 - Output buffer too small");
    switch(uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_001391f1_caseD_0;
    case 1:
      goto switchD_001391f1_caseD_2;
    case 2:
      goto switchD_001391f1_caseD_4;
    case 3:
      goto switchD_001391f1_caseD_6;
    case 4:
      goto switchD_001391f1_caseD_8;
    case 5:
      goto switchD_001391f1_caseD_a;
    case 6:
      goto switchD_001391f1_caseD_c;
    case 7:
      goto switchD_001391f1_caseD_e;
    default:
      goto switchD_001395b7_caseD_47;
    case 10:
      goto switchD_001391f1_caseD_14;
    case 0xb:
      goto switchD_001391f1_caseD_16;
    case 0x15:
      goto switchD_001391f1_caseD_2a;
    }
  case 0x2a:
switchD_001391f1_caseD_2a:
    pcVar4 = "BASE64 - Invalid character in input";
    break;
  case 0x30:
    pcVar4 = "DES - The data input has an invalid length";
    break;
  case 0x32:
    pcVar4 = "CTR_DRBG - The entropy source failed";
    break;
  case 0x34:
    pcVar4 = "CTR_DRBG - Too many random requested in single call";
    break;
  case 0x36:
    pcVar4 = "CTR_DRBG - Input too large (Entropy + additional)";
    break;
  case 0x38:
    pcVar4 = "CTR_DRBG - Read/write error in file";
    break;
  case 0x3a:
    pcVar4 = "ENTROPY - Critical entropy source failure";
    break;
  case 0x3b:
    pcVar4 = "ENTROPY - No strong sources have been added to poll";
    break;
  case 0x3c:
    pcVar4 = "ENTROPY - No more sources can be added";
    break;
  case 0x3d:
    pcVar4 = "ENTROPY - Read/write error in file";
    break;
  case 0x3e:
    pcVar4 = "ENTROPY - No sources have been added to poll";
    break;
  case 0x40:
    pcVar4 = "NET - Failed to open a socket";
    break;
  default:
    switch(uVar5) {
    case 0x60:
      pcVar4 = "ASN1 - Out of data when parsing an ASN1 data structure";
      break;
    default:
      goto switchD_001391f1_caseD_9;
    case 0x62:
      pcVar4 = "ASN1 - ASN1 tag was of an unexpected value";
      break;
    case 100:
      pcVar4 = "ASN1 - Error when trying to determine the length or invalid length";
      break;
    case 0x66:
      pcVar4 = "ASN1 - Actual length differs from expected length";
      break;
    case 0x68:
      pcVar4 = "ASN1 - Data is invalid. (not used)";
      break;
    case 0x6a:
      pcVar4 = "ASN1 - Memory allocation failed";
      break;
    case 0x6c:
      pcVar4 = "ASN1 - Buffer too small when writing ASN.1 data structure";
    }
  }
  snprintf(buf,local_68,pcVar4);
switchD_001395b7_caseD_47:
  if (*buf != '\0') {
    return;
  }
  snprintf(buf,local_68,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar5);
  return;
switchD_0013807c_caseD_2:
  snprintf(buf,buflen,
           "SSL - Public key type mismatch (eg, asked for RSA key exchange and presented EC key)");
LAB_001380de:
  if (0x287f < uVar5) {
    if (0x687f < uVar5) {
      if (0x6a7f < uVar5) {
LAB_00138103:
        if (0x6b7f < uVar5) {
          if (uVar5 != 0x6b80) {
            if (uVar5 != 0x6c00) {
              if (uVar5 != 0x6c80) goto switchD_001390aa_default;
              goto switchD_0013807c_caseD_1;
            }
            goto switchD_0013807c_caseD_0;
          }
          goto switchD_001380bf_caseD_0;
        }
        goto LAB_001384c2;
      }
      goto LAB_001381a5;
    }
    goto LAB_00138183;
  }
  if (uVar5 < 0x2480) goto LAB_001381bc;
  if (uVar5 < 0x2680) goto LAB_0013822a;
  if (0x277f < uVar5) goto LAB_001388f8;
  if (uVar5 != 0x2680) goto LAB_001387dc;
switchD_00138f5a_caseD_2:
  pcVar4 = "X509 - Signature algorithms do not match. (see \\c ::mbedtls_x509_crt sig_oid)";
LAB_00138feb:
  snprintf(buf,buflen,pcVar4);
LAB_00138fff:
  switch(uVar5 - 0x2700 >> 7) {
  case 0:
    goto switchD_00138f5a_caseD_3;
  case 1:
    goto switchD_00139060_caseD_0;
  case 2:
    goto switchD_001390aa_caseD_0;
  case 3:
    goto switchD_001390aa_caseD_1;
  case 4:
    goto switchD_001390aa_caseD_2;
  case 5:
    goto switchD_001390aa_caseD_3;
  }
  goto switchD_001390aa_default;
}

Assistant:

void mbedtls_strerror( int ret, char *buf, size_t buflen )
{
    size_t len;
    int use_ret;

    if( buflen == 0 )
        return;

    memset( buf, 0x00, buflen );

    if( ret < 0 )
        ret = -ret;

    if( ret & 0xFF80 )
    {
        use_ret = ret & 0xFF80;

        // High level error codes
        //
        // BEGIN generated code
#if defined(MBEDTLS_CIPHER_C)
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Decryption of block requires a full block" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_AUTH_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Authentication failed (for AEAD modes)" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_CONTEXT) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The context is invalid, eg because it was free()ed" );
#endif /* MBEDTLS_CIPHER_C */

#if defined(MBEDTLS_DHM_C)
        if( use_ret == -(MBEDTLS_ERR_DHM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "DHM - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the public values failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the public value failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_CALC_SECRET_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Calculation of the DHM secret failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "DHM - The ASN.1 data is not formatted correctly" );
        if( use_ret == -(MBEDTLS_ERR_DHM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "DHM - Read/write of file failed" );
#endif /* MBEDTLS_DHM_C */

#if defined(MBEDTLS_ECP_C)
        if( use_ret == -(MBEDTLS_ERR_ECP_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "ECP - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer is too small to write to" );
        if( use_ret == -(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "ECP - Requested curve not available" );
        if( use_ret == -(MBEDTLS_ERR_ECP_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The signature is not valid" );
        if( use_ret == -(MBEDTLS_ERR_ECP_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_RANDOM_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Generation of random value, such as (ephemeral) key, failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_INVALID_KEY) )
            mbedtls_snprintf( buf, buflen, "ECP - Invalid private or public key" );
        if( use_ret == -(MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "ECP - Signature is valid but shorter than the user-supplied length" );
#endif /* MBEDTLS_ECP_C */

#if defined(MBEDTLS_MD_C)
        if( use_ret == -(MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "MD - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_MD_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "MD - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_MD_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_MD_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "MD - Opening or reading of file failed" );
#endif /* MBEDTLS_MD_C */

#if defined(MBEDTLS_PEM_PARSE_C) || defined(MBEDTLS_PEM_WRITE_C)
        if( use_ret == -(MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) )
            mbedtls_snprintf( buf, buflen, "PEM - No PEM header or footer found" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - PEM string is not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PEM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PEM - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_ENC_IV) )
            mbedtls_snprintf( buf, buflen, "PEM - RSA IV is not in hex-format" );
        if( use_ret == -(MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG) )
            mbedtls_snprintf( buf, buflen, "PEM - Unsupported key encryption algorithm" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PEM - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PEM - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PEM - Unavailable feature, e.g. hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_PEM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - Bad input parameters to function" );
#endif /* MBEDTLS_PEM_PARSE_C || MBEDTLS_PEM_WRITE_C */

#if defined(MBEDTLS_PK_C)
        if( use_ret == -(MBEDTLS_ERR_PK_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Type mismatch, eg attempt to encrypt with an ECDSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PK - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PK_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "PK - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "PK - Unsupported key version" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PK - Invalid key tag or value" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_PK_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - Key algorithm is unsupported (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PK - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_PUBKEY) )
            mbedtls_snprintf( buf, buflen, "PK - The pubkey tag or value is invalid (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE) )
            mbedtls_snprintf( buf, buflen, "PK - Elliptic curve is unsupported (only NIST curves are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PK - Unavailable feature, e.g. RSA disabled for RSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - The signature is valid but its length is less than expected" );
#endif /* MBEDTLS_PK_C */

#if defined(MBEDTLS_PKCS12_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Feature not available, e.g. unsupported encryption scheme" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - PBE ASN.1 data not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS12_C */

#if defined(MBEDTLS_PKCS5_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Unexpected ASN.1 data" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Requested encryption or digest alg not available" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS5_C */

#if defined(MBEDTLS_RSA_C)
        if( use_ret == -(MBEDTLS_ERR_RSA_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "RSA - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_RSA_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "RSA - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_GEN_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Something failed during generation of a key" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_CHECK_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Key failed to pass the library's validity check" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The public key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PRIVATE_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The private key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The PKCS#1 verification failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "RSA - The output buffer for decryption is not large enough" );
        if( use_ret == -(MBEDTLS_ERR_RSA_RNG_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The random generator failed to generate non-zeros" );
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_SSL_TLS_C)
        if( use_ret == -(MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "SSL - The requested feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "SSL - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_MAC) )
            mbedtls_snprintf( buf, buflen, "SSL - Verification of the message MAC failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_RECORD) )
            mbedtls_snprintf( buf, buflen, "SSL - An invalid SSL record was received" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CONN_EOF) )
            mbedtls_snprintf( buf, buflen, "SSL - The connection indicated an EOF" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNKNOWN_CIPHER) )
            mbedtls_snprintf( buf, buflen, "SSL - An unknown cipher was received" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_CIPHER_CHOSEN) )
            mbedtls_snprintf( buf, buflen, "SSL - The server has no ciphersuites in common with the client" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_RNG) )
            mbedtls_snprintf( buf, buflen, "SSL - No RNG was provided to the SSL module" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE) )
            mbedtls_snprintf( buf, buflen, "SSL - No client certification received from the client, but required by the authentication mode" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CERTIFICATE_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Our own certificate(s) is/are too large to send in an SSL message" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CERTIFICATE_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - The own certificate is not set, but needed by the server" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - The own private key or pre-shared key is not set, but needed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - No CA Chain is set, but required to operate" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE) )
            mbedtls_snprintf( buf, buflen, "SSL - An unexpected message was received from our peer" );
        if( use_ret == -(MBEDTLS_ERR_SSL_FATAL_ALERT_MESSAGE) )
        {
            mbedtls_snprintf( buf, buflen, "SSL - A fatal alert message was received from our peer" );
            return;
        }
        if( use_ret == -(MBEDTLS_ERR_SSL_PEER_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Verification of our peer failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY) )
            mbedtls_snprintf( buf, buflen, "SSL - The peer notified us that the connection is going to be closed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientHello handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerHello handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the Certificate handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the CertificateRequest handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerKeyExchange handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO_DONE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerHelloDone handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Read Public" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_CS) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Calculate Secret" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the CertificateVerify handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CHANGE_CIPHER_SPEC) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ChangeCipherSpec handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_FINISHED) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the Finished handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Hardware acceleration function returned with error" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH) )
            mbedtls_snprintf( buf, buflen, "SSL - Hardware acceleration function skipped / left alone data" );
        if( use_ret == -(MBEDTLS_ERR_SSL_COMPRESSION_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the compression / decompression failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION) )
            mbedtls_snprintf( buf, buflen, "SSL - Handshake protocol not within min/max boundaries" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_NEW_SESSION_TICKET) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the NewSessionTicket handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - Session ticket has expired" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "SSL - Public key type mismatch (eg, asked for RSA key exchange and presented EC key)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY) )
            mbedtls_snprintf( buf, buflen, "SSL - Unknown identity received (eg, PSK identity)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INTERNAL_ERROR) )
            mbedtls_snprintf( buf, buflen, "SSL - Internal error (eg, unexpected failure in lower-level module)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_COUNTER_WRAPPING) )
            mbedtls_snprintf( buf, buflen, "SSL - A counter would wrap (eg, too many messages exchanged)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO) )
            mbedtls_snprintf( buf, buflen, "SSL - Unexpected message at ServerHello in renegotiation" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - DTLS client must retry for hello verification" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "SSL - A buffer is too small to receive or write a message" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_USABLE_CIPHERSUITE) )
            mbedtls_snprintf( buf, buflen, "SSL - None of the common ciphersuites is usable (eg, no suitable certificate, see debug messages)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WANT_READ) )
            mbedtls_snprintf( buf, buflen, "SSL - Connection requires a read call" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WANT_WRITE) )
            mbedtls_snprintf( buf, buflen, "SSL - Connection requires a write call" );
        if( use_ret == -(MBEDTLS_ERR_SSL_TIMEOUT) )
            mbedtls_snprintf( buf, buflen, "SSL - The operation timed out" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CLIENT_RECONNECT) )
            mbedtls_snprintf( buf, buflen, "SSL - The client initiated a reconnect from the same port" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNEXPECTED_RECORD) )
            mbedtls_snprintf( buf, buflen, "SSL - Record header looks valid but is not expected" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NON_FATAL) )
            mbedtls_snprintf( buf, buflen, "SSL - The alert message received indicates a non-fatal error" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_VERIFY_HASH) )
            mbedtls_snprintf( buf, buflen, "SSL - Couldn't set the hash for verifying CertificateVerify" );
#endif /* MBEDTLS_SSL_TLS_C */

#if defined(MBEDTLS_X509_USE_C) || defined(MBEDTLS_X509_CREATE_C)
        if( use_ret == -(MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "X509 - Unavailable feature, e.g. RSA hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_OID) )
            mbedtls_snprintf( buf, buflen, "X509 - Requested OID is unknown" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "X509 - The CRT/CRL/CSR format is invalid, e.g. different type expected" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "X509 - The CRT/CRL/CSR version element is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_SERIAL) )
            mbedtls_snprintf( buf, buflen, "X509 - The serial tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "X509 - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_NAME) )
            mbedtls_snprintf( buf, buflen, "X509 - The name tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_DATE) )
            mbedtls_snprintf( buf, buflen, "X509 - The date tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_SIGNATURE) )
            mbedtls_snprintf( buf, buflen, "X509 - The signature tag or value invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_EXTENSIONS) )
            mbedtls_snprintf( buf, buflen, "X509 - The extension tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_VERSION) )
            mbedtls_snprintf( buf, buflen, "X509 - CRT/CRL/CSR has an unsupported version number" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG) )
            mbedtls_snprintf( buf, buflen, "X509 - Signature algorithm (oid) is unsupported" );
        if( use_ret == -(MBEDTLS_ERR_X509_SIG_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "X509 - Signature algorithms do not match. (see \\c ::mbedtls_x509_crt sig_oid)" );
        if( use_ret == -(MBEDTLS_ERR_X509_CERT_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "X509 - Certificate verification failed, e.g. CRL, CA or signature check failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_CERT_UNKNOWN_FORMAT) )
            mbedtls_snprintf( buf, buflen, "X509 - Format not recognized as DER or PEM" );
        if( use_ret == -(MBEDTLS_ERR_X509_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "X509 - Input invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "X509 - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "X509 - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "X509 - Destination buffer is too small" );
#endif /* MBEDTLS_X509_USE_C || MBEDTLS_X509_CREATE_C */
        // END generated code

        if( strlen( buf ) == 0 )
            mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
    }

    use_ret = ret & ~0xFF80;

    if( use_ret == 0 )
        return;

    // If high level code is present, make a concatenation between both
    // error strings.
    //
    len = strlen( buf );

    if( len > 0 )
    {
        if( buflen - len < 5 )
            return;

        mbedtls_snprintf( buf + len, buflen - len, " : " );

        buf += len + 3;
        buflen -= len + 3;
    }

    // Low level error codes
    //
    // BEGIN generated code
#if defined(MBEDTLS_AES_C)
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid data input length" );
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_ASN1_PARSE_C)
    if( use_ret == -(MBEDTLS_ERR_ASN1_OUT_OF_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Out of data when parsing an ASN1 data structure" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) )
        mbedtls_snprintf( buf, buflen, "ASN1 - ASN1 tag was of an unexpected value" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Error when trying to determine the length or invalid length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_LENGTH_MISMATCH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Actual length differs from expected length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Data is invalid. (not used)" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Memory allocation failed" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Buffer too small when writing ASN.1 data structure" );
#endif /* MBEDTLS_ASN1_PARSE_C */

#if defined(MBEDTLS_BASE64_C)
    if( use_ret == -(MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Output buffer too small" );
    if( use_ret == -(MBEDTLS_ERR_BASE64_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Invalid character in input" );
#endif /* MBEDTLS_BASE64_C */

#if defined(MBEDTLS_BIGNUM_C)
    if( use_ret == -(MBEDTLS_ERR_MPI_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - An error occurred while reading from or writing to a file" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_MPI_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - There is an invalid character in the digit string" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The buffer is too small to write to" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NEGATIVE_VALUE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are negative or result in illegal output" );
    if( use_ret == -(MBEDTLS_ERR_MPI_DIVISION_BY_ZERO) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input argument for division is zero, which is not allowed" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NOT_ACCEPTABLE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are not acceptable" );
    if( use_ret == -(MBEDTLS_ERR_MPI_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Memory allocation failed" );
#endif /* MBEDTLS_BIGNUM_C */

#if defined(MBEDTLS_BLOWFISH_C)
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid data input length" );
#endif /* MBEDTLS_BLOWFISH_C */

#if defined(MBEDTLS_CAMELLIA_C)
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid data input length" );
#endif /* MBEDTLS_CAMELLIA_C */

#if defined(MBEDTLS_CCM_C)
    if( use_ret == -(MBEDTLS_ERR_CCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "CCM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_CCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - Authenticated decryption failed" );
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_CTR_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The entropy source failed" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Read/write error in file" );
#endif /* MBEDTLS_CTR_DRBG_C */

#if defined(MBEDTLS_DES_C)
    if( use_ret == -(MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "DES - The data input has an invalid length" );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_ENTROPY_C)
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Critical entropy source failure" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_MAX_SOURCES) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No more sources can be added" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No strong sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Read/write error in file" );
#endif /* MBEDTLS_ENTROPY_C */

#if defined(MBEDTLS_GCM_C)
    if( use_ret == -(MBEDTLS_ERR_GCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "GCM - Bad input parameters to function" );
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Read/write error in file" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - The entropy source failed" );
#endif /* MBEDTLS_HMAC_DRBG_C */

#if defined(MBEDTLS_NET_C)
    if( use_ret == -(MBEDTLS_ERR_NET_SOCKET_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Failed to open a socket" );
    if( use_ret == -(MBEDTLS_ERR_NET_CONNECT_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - The connection to the given server / port failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_BIND_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Binding of the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_LISTEN_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Could not listen on the socket" );
    if( use_ret == -(MBEDTLS_ERR_NET_ACCEPT_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Could not accept the incoming connection" );
    if( use_ret == -(MBEDTLS_ERR_NET_RECV_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Reading information from the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_SEND_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Sending information through the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_CONN_RESET) )
        mbedtls_snprintf( buf, buflen, "NET - Connection was reset by peer" );
    if( use_ret == -(MBEDTLS_ERR_NET_UNKNOWN_HOST) )
        mbedtls_snprintf( buf, buflen, "NET - Failed to get an IP address for the given hostname" );
    if( use_ret == -(MBEDTLS_ERR_NET_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "NET - Buffer is too small to hold the data" );
    if( use_ret == -(MBEDTLS_ERR_NET_INVALID_CONTEXT) )
        mbedtls_snprintf( buf, buflen, "NET - The context is invalid, eg because it was free()ed" );
#endif /* MBEDTLS_NET_C */

#if defined(MBEDTLS_OID_C)
    if( use_ret == -(MBEDTLS_ERR_OID_NOT_FOUND) )
        mbedtls_snprintf( buf, buflen, "OID - OID is not found" );
    if( use_ret == -(MBEDTLS_ERR_OID_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "OID - output buffer is too small" );
#endif /* MBEDTLS_OID_C */

#if defined(MBEDTLS_PADLOCK_C)
    if( use_ret == -(MBEDTLS_ERR_PADLOCK_DATA_MISALIGNED) )
        mbedtls_snprintf( buf, buflen, "PADLOCK - Input data should be aligned" );
#endif /* MBEDTLS_PADLOCK_C */

#if defined(MBEDTLS_THREADING_C)
    if( use_ret == -(MBEDTLS_ERR_THREADING_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "THREADING - The selected feature is not available" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "THREADING - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_MUTEX_ERROR) )
        mbedtls_snprintf( buf, buflen, "THREADING - Locking / unlocking / free failed with error code" );
#endif /* MBEDTLS_THREADING_C */

#if defined(MBEDTLS_XTEA_C)
    if( use_ret == -(MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "XTEA - The data input has an invalid length" );
#endif /* MBEDTLS_XTEA_C */
    // END generated code

    if( strlen( buf ) != 0 )
        return;

    mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
}